

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::sse2::CurveNiIntersectorK<4,4>::
     intersect_t<embree::sse2::SweepCurve1IntersectorK<embree::BezierCurveT,4>,embree::sse2::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  Primitive *pPVar5;
  Primitive PVar6;
  Geometry *pGVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined8 uVar15;
  RTCFeatureFlags RVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined6 uVar35;
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 auVar47 [12];
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  undefined1 auVar50 [12];
  int iVar51;
  undefined4 uVar52;
  ulong uVar53;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  undefined4 uVar58;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  ulong extraout_RAX_05;
  ulong extraout_RAX_06;
  RTCFilterFunctionN p_Var54;
  RTCIntersectArguments *pRVar55;
  RayHitK<4> *pRVar56;
  ulong uVar57;
  ulong uVar59;
  RTCIntersectArguments *pRVar60;
  long lVar61;
  long lVar62;
  ulong uVar63;
  bool bVar64;
  uint uVar65;
  uint uVar66;
  uint uVar67;
  uint uVar68;
  uint uVar69;
  short sVar70;
  float fVar71;
  float fVar117;
  float fVar119;
  __m128 a_1;
  float fVar72;
  undefined2 uVar116;
  undefined1 auVar73 [16];
  undefined1 auVar76 [16];
  undefined1 auVar79 [16];
  float fVar118;
  float fVar120;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar86 [16];
  undefined1 auVar89 [16];
  undefined1 auVar92 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  float fVar121;
  float fVar145;
  float fVar146;
  vfloat4 a;
  undefined1 auVar122 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  float fVar147;
  float fVar160;
  float fVar161;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  float fVar162;
  float fVar173;
  float fVar174;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  float fVar175;
  float fVar187;
  float fVar188;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  float fVar189;
  float fVar199;
  float fVar200;
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  float fVar201;
  float fVar211;
  float fVar212;
  undefined1 auVar202 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  float fVar213;
  float fVar233;
  float fVar234;
  undefined1 auVar214 [16];
  undefined1 auVar217 [16];
  undefined1 auVar220 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  float fVar235;
  float fVar243;
  float fVar244;
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  float fVar245;
  float fVar256;
  float fVar257;
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar252 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  float fVar258;
  float fVar261;
  float fVar262;
  float fVar263;
  float fVar264;
  float fVar265;
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  float fVar266;
  float fVar267;
  float fVar272;
  float fVar273;
  undefined1 auVar268 [16];
  float fVar274;
  undefined1 auVar271 [16];
  float fVar275;
  float fVar276;
  float fVar277;
  float fVar278;
  float fVar279;
  float fVar282;
  float fVar283;
  float fVar284;
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  float fVar285;
  float fVar286;
  float fVar287;
  float fVar288;
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx u_outer1;
  vfloatx u_outer0;
  vboolx valid;
  BBox<embree::vfloat_impl<4>_> tp1;
  BBox<embree::vfloat_impl<4>_> tp0;
  StackEntry stack [4];
  undefined1 local_658 [8];
  float fStack_650;
  float fStack_64c;
  undefined1 local_638 [8];
  float fStack_630;
  float fStack_62c;
  undefined8 local_5f8;
  undefined8 local_578;
  undefined8 uStack_570;
  ulong local_568;
  ulong local_560;
  undefined1 local_558 [4];
  float fStack_554;
  undefined8 uStack_550;
  RTCRayQueryContext *local_548;
  RayHitK<4> *local_540;
  RTCIntersectArguments *local_538;
  uint local_530;
  undefined1 local_528 [8];
  float fStack_520;
  float fStack_51c;
  float local_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float local_508;
  float fStack_504;
  float fStack_500;
  float fStack_4fc;
  float local_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float local_4e8;
  float fStack_4e4;
  float fStack_4e0;
  float fStack_4dc;
  undefined1 local_4d8 [8];
  float fStack_4d0;
  float fStack_4cc;
  undefined1 local_4c8 [8];
  float fStack_4c0;
  float fStack_4bc;
  undefined1 local_4b8 [8];
  float fStack_4b0;
  float fStack_4ac;
  float local_4a8;
  float fStack_4a4;
  undefined4 uStack_4a0;
  undefined4 uStack_49c;
  float local_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float local_488;
  float fStack_484;
  float fStack_480;
  float fStack_47c;
  float local_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float local_468;
  float fStack_464;
  float fStack_460;
  float fStack_45c;
  undefined1 local_458 [8];
  float fStack_450;
  float fStack_44c;
  float local_448;
  float fStack_444;
  float fStack_440;
  float fStack_43c;
  float local_438;
  float fStack_434;
  float fStack_430;
  undefined4 uStack_42c;
  float local_428;
  float fStack_424;
  float fStack_420;
  float fStack_41c;
  undefined8 *local_410;
  float local_408;
  float fStack_404;
  float fStack_400;
  float fStack_3fc;
  undefined1 local_3f8 [16];
  undefined1 local_3e8 [8];
  float fStack_3e0;
  float fStack_3dc;
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [16];
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  undefined1 local_3a8 [8];
  float fStack_3a0;
  float fStack_39c;
  undefined1 local_398 [8];
  float fStack_390;
  float fStack_38c;
  undefined1 local_388 [16];
  float local_378 [4];
  float local_368 [4];
  Primitive *local_358;
  ulong local_350;
  uint local_348;
  uint uStack_344;
  uint uStack_340;
  uint uStack_33c;
  uint local_338;
  uint uStack_334;
  uint uStack_330;
  uint uStack_32c;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  undefined1 local_2d8 [12];
  float fStack_2cc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  uint local_268;
  uint uStack_264;
  uint uStack_260;
  uint uStack_25c;
  uint local_258;
  uint uStack_254;
  uint uStack_250;
  uint uStack_24c;
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [16];
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [16];
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  undefined1 local_118 [8];
  float fStack_110;
  float fStack_10c;
  undefined1 local_108 [16];
  uint auStack_f8 [4];
  float afStack_e8 [6];
  float afStack_d0 [40];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 uVar115;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar154 [16];
  undefined1 auVar157 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar251 [16];
  undefined1 auVar253 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  
  PVar6 = prim[1];
  uVar53 = (ulong)(byte)PVar6;
  pPVar5 = prim + uVar53 * 0x19 + 6;
  fVar161 = *(float *)(pPVar5 + 0xc);
  fVar175 = (*(float *)(ray + k * 4) - *(float *)pPVar5) * fVar161;
  fVar187 = (*(float *)(ray + k * 4 + 0x10) - *(float *)(pPVar5 + 4)) * fVar161;
  fVar188 = (*(float *)(ray + k * 4 + 0x20) - *(float *)(pPVar5 + 8)) * fVar161;
  fVar147 = *(float *)(ray + k * 4 + 0x40) * fVar161;
  fVar160 = *(float *)(ray + k * 4 + 0x50) * fVar161;
  fVar161 = *(float *)(ray + k * 4 + 0x60) * fVar161;
  uVar58 = *(undefined4 *)(prim + uVar53 * 4 + 6);
  uVar115 = (undefined1)((uint)uVar58 >> 0x18);
  uVar116 = CONCAT11(uVar115,uVar115);
  uVar115 = (undefined1)((uint)uVar58 >> 0x10);
  uVar15 = CONCAT35(CONCAT21(uVar116,uVar115),CONCAT14(uVar115,uVar58));
  uVar115 = (undefined1)((uint)uVar58 >> 8);
  uVar35 = CONCAT51(CONCAT41((int)((ulong)uVar15 >> 0x20),uVar115),uVar115);
  sVar70 = CONCAT11((char)uVar58,(char)uVar58);
  uVar63 = CONCAT62(uVar35,sVar70);
  auVar230._8_4_ = 0;
  auVar230._0_8_ = uVar63;
  auVar230._12_2_ = uVar116;
  auVar230._14_2_ = uVar116;
  uVar116 = (undefined2)((ulong)uVar15 >> 0x20);
  auVar193._12_4_ = auVar230._12_4_;
  auVar193._8_2_ = 0;
  auVar193._0_8_ = uVar63;
  auVar193._10_2_ = uVar116;
  auVar192._10_6_ = auVar193._10_6_;
  auVar192._8_2_ = uVar116;
  auVar192._0_8_ = uVar63;
  uVar116 = (undefined2)uVar35;
  auVar36._4_8_ = auVar192._8_8_;
  auVar36._2_2_ = uVar116;
  auVar36._0_2_ = uVar116;
  fVar121 = (float)((int)sVar70 >> 8);
  fVar145 = (float)(auVar36._0_4_ >> 0x18);
  fVar146 = (float)(auVar192._8_4_ >> 0x18);
  uVar58 = *(undefined4 *)(prim + uVar53 * 5 + 6);
  uVar115 = (undefined1)((uint)uVar58 >> 0x18);
  uVar116 = CONCAT11(uVar115,uVar115);
  uVar115 = (undefined1)((uint)uVar58 >> 0x10);
  uVar15 = CONCAT35(CONCAT21(uVar116,uVar115),CONCAT14(uVar115,uVar58));
  uVar115 = (undefined1)((uint)uVar58 >> 8);
  uVar35 = CONCAT51(CONCAT41((int)((ulong)uVar15 >> 0x20),uVar115),uVar115);
  sVar70 = CONCAT11((char)uVar58,(char)uVar58);
  uVar63 = CONCAT62(uVar35,sVar70);
  auVar75._8_4_ = 0;
  auVar75._0_8_ = uVar63;
  auVar75._12_2_ = uVar116;
  auVar75._14_2_ = uVar116;
  uVar116 = (undefined2)((ulong)uVar15 >> 0x20);
  auVar74._12_4_ = auVar75._12_4_;
  auVar74._8_2_ = 0;
  auVar74._0_8_ = uVar63;
  auVar74._10_2_ = uVar116;
  auVar73._10_6_ = auVar74._10_6_;
  auVar73._8_2_ = uVar116;
  auVar73._0_8_ = uVar63;
  uVar116 = (undefined2)uVar35;
  auVar37._4_8_ = auVar73._8_8_;
  auVar37._2_2_ = uVar116;
  auVar37._0_2_ = uVar116;
  fVar189 = (float)((int)sVar70 >> 8);
  fVar199 = (float)(auVar37._0_4_ >> 0x18);
  fVar200 = (float)(auVar73._8_4_ >> 0x18);
  uVar58 = *(undefined4 *)(prim + uVar53 * 6 + 6);
  uVar115 = (undefined1)((uint)uVar58 >> 0x18);
  uVar116 = CONCAT11(uVar115,uVar115);
  uVar115 = (undefined1)((uint)uVar58 >> 0x10);
  uVar15 = CONCAT35(CONCAT21(uVar116,uVar115),CONCAT14(uVar115,uVar58));
  uVar115 = (undefined1)((uint)uVar58 >> 8);
  uVar35 = CONCAT51(CONCAT41((int)((ulong)uVar15 >> 0x20),uVar115),uVar115);
  sVar70 = CONCAT11((char)uVar58,(char)uVar58);
  uVar63 = CONCAT62(uVar35,sVar70);
  auVar78._8_4_ = 0;
  auVar78._0_8_ = uVar63;
  auVar78._12_2_ = uVar116;
  auVar78._14_2_ = uVar116;
  uVar116 = (undefined2)((ulong)uVar15 >> 0x20);
  auVar77._12_4_ = auVar78._12_4_;
  auVar77._8_2_ = 0;
  auVar77._0_8_ = uVar63;
  auVar77._10_2_ = uVar116;
  auVar76._10_6_ = auVar77._10_6_;
  auVar76._8_2_ = uVar116;
  auVar76._0_8_ = uVar63;
  uVar116 = (undefined2)uVar35;
  auVar38._4_8_ = auVar76._8_8_;
  auVar38._2_2_ = uVar116;
  auVar38._0_2_ = uVar116;
  fVar162 = (float)((int)sVar70 >> 8);
  fVar173 = (float)(auVar38._0_4_ >> 0x18);
  fVar174 = (float)(auVar76._8_4_ >> 0x18);
  uVar58 = *(undefined4 *)(prim + uVar53 * 0xb + 6);
  uVar115 = (undefined1)((uint)uVar58 >> 0x18);
  uVar116 = CONCAT11(uVar115,uVar115);
  uVar115 = (undefined1)((uint)uVar58 >> 0x10);
  uVar15 = CONCAT35(CONCAT21(uVar116,uVar115),CONCAT14(uVar115,uVar58));
  uVar115 = (undefined1)((uint)uVar58 >> 8);
  uVar35 = CONCAT51(CONCAT41((int)((ulong)uVar15 >> 0x20),uVar115),uVar115);
  sVar70 = CONCAT11((char)uVar58,(char)uVar58);
  uVar63 = CONCAT62(uVar35,sVar70);
  auVar81._8_4_ = 0;
  auVar81._0_8_ = uVar63;
  auVar81._12_2_ = uVar116;
  auVar81._14_2_ = uVar116;
  uVar116 = (undefined2)((ulong)uVar15 >> 0x20);
  auVar80._12_4_ = auVar81._12_4_;
  auVar80._8_2_ = 0;
  auVar80._0_8_ = uVar63;
  auVar80._10_2_ = uVar116;
  auVar79._10_6_ = auVar80._10_6_;
  auVar79._8_2_ = uVar116;
  auVar79._0_8_ = uVar63;
  uVar116 = (undefined2)uVar35;
  auVar39._4_8_ = auVar79._8_8_;
  auVar39._2_2_ = uVar116;
  auVar39._0_2_ = uVar116;
  fVar71 = (float)((int)sVar70 >> 8);
  fVar117 = (float)(auVar39._0_4_ >> 0x18);
  fVar119 = (float)(auVar79._8_4_ >> 0x18);
  uVar58 = *(undefined4 *)(prim + (ulong)((uint)(byte)PVar6 * 0xc) + 6);
  uVar115 = (undefined1)((uint)uVar58 >> 0x18);
  uVar116 = CONCAT11(uVar115,uVar115);
  uVar115 = (undefined1)((uint)uVar58 >> 0x10);
  uVar15 = CONCAT35(CONCAT21(uVar116,uVar115),CONCAT14(uVar115,uVar58));
  uVar115 = (undefined1)((uint)uVar58 >> 8);
  uVar35 = CONCAT51(CONCAT41((int)((ulong)uVar15 >> 0x20),uVar115),uVar115);
  sVar70 = CONCAT11((char)uVar58,(char)uVar58);
  uVar63 = CONCAT62(uVar35,sVar70);
  auVar204._8_4_ = 0;
  auVar204._0_8_ = uVar63;
  auVar204._12_2_ = uVar116;
  auVar204._14_2_ = uVar116;
  uVar116 = (undefined2)((ulong)uVar15 >> 0x20);
  auVar203._12_4_ = auVar204._12_4_;
  auVar203._8_2_ = 0;
  auVar203._0_8_ = uVar63;
  auVar203._10_2_ = uVar116;
  auVar202._10_6_ = auVar203._10_6_;
  auVar202._8_2_ = uVar116;
  auVar202._0_8_ = uVar63;
  uVar116 = (undefined2)uVar35;
  auVar40._4_8_ = auVar202._8_8_;
  auVar40._2_2_ = uVar116;
  auVar40._0_2_ = uVar116;
  fVar201 = (float)((int)sVar70 >> 8);
  fVar211 = (float)(auVar40._0_4_ >> 0x18);
  fVar212 = (float)(auVar202._8_4_ >> 0x18);
  uVar58 = *(undefined4 *)(prim + (uint)(byte)PVar6 * 0xc + uVar53 + 6);
  uVar115 = (undefined1)((uint)uVar58 >> 0x18);
  uVar116 = CONCAT11(uVar115,uVar115);
  uVar115 = (undefined1)((uint)uVar58 >> 0x10);
  uVar15 = CONCAT35(CONCAT21(uVar116,uVar115),CONCAT14(uVar115,uVar58));
  uVar115 = (undefined1)((uint)uVar58 >> 8);
  uVar35 = CONCAT51(CONCAT41((int)((ulong)uVar15 >> 0x20),uVar115),uVar115);
  sVar70 = CONCAT11((char)uVar58,(char)uVar58);
  uVar63 = CONCAT62(uVar35,sVar70);
  auVar216._8_4_ = 0;
  auVar216._0_8_ = uVar63;
  auVar216._12_2_ = uVar116;
  auVar216._14_2_ = uVar116;
  uVar116 = (undefined2)((ulong)uVar15 >> 0x20);
  auVar215._12_4_ = auVar216._12_4_;
  auVar215._8_2_ = 0;
  auVar215._0_8_ = uVar63;
  auVar215._10_2_ = uVar116;
  auVar214._10_6_ = auVar215._10_6_;
  auVar214._8_2_ = uVar116;
  auVar214._0_8_ = uVar63;
  uVar116 = (undefined2)uVar35;
  auVar41._4_8_ = auVar214._8_8_;
  auVar41._2_2_ = uVar116;
  auVar41._0_2_ = uVar116;
  fVar245 = (float)((int)sVar70 >> 8);
  fVar256 = (float)(auVar41._0_4_ >> 0x18);
  fVar257 = (float)(auVar214._8_4_ >> 0x18);
  uVar57 = (ulong)(uint)((int)(uVar53 * 9) * 2);
  uVar58 = *(undefined4 *)(prim + uVar57 + 6);
  uVar115 = (undefined1)((uint)uVar58 >> 0x18);
  uVar116 = CONCAT11(uVar115,uVar115);
  uVar115 = (undefined1)((uint)uVar58 >> 0x10);
  uVar15 = CONCAT35(CONCAT21(uVar116,uVar115),CONCAT14(uVar115,uVar58));
  uVar115 = (undefined1)((uint)uVar58 >> 8);
  uVar35 = CONCAT51(CONCAT41((int)((ulong)uVar15 >> 0x20),uVar115),uVar115);
  sVar70 = CONCAT11((char)uVar58,(char)uVar58);
  uVar63 = CONCAT62(uVar35,sVar70);
  auVar219._8_4_ = 0;
  auVar219._0_8_ = uVar63;
  auVar219._12_2_ = uVar116;
  auVar219._14_2_ = uVar116;
  uVar116 = (undefined2)((ulong)uVar15 >> 0x20);
  auVar218._12_4_ = auVar219._12_4_;
  auVar218._8_2_ = 0;
  auVar218._0_8_ = uVar63;
  auVar218._10_2_ = uVar116;
  auVar217._10_6_ = auVar218._10_6_;
  auVar217._8_2_ = uVar116;
  auVar217._0_8_ = uVar63;
  uVar116 = (undefined2)uVar35;
  auVar42._4_8_ = auVar217._8_8_;
  auVar42._2_2_ = uVar116;
  auVar42._0_2_ = uVar116;
  fVar235 = (float)((int)sVar70 >> 8);
  fVar243 = (float)(auVar42._0_4_ >> 0x18);
  fVar244 = (float)(auVar217._8_4_ >> 0x18);
  uVar58 = *(undefined4 *)(prim + uVar57 + uVar53 + 6);
  uVar115 = (undefined1)((uint)uVar58 >> 0x18);
  uVar116 = CONCAT11(uVar115,uVar115);
  uVar115 = (undefined1)((uint)uVar58 >> 0x10);
  uVar15 = CONCAT35(CONCAT21(uVar116,uVar115),CONCAT14(uVar115,uVar58));
  uVar115 = (undefined1)((uint)uVar58 >> 8);
  uVar35 = CONCAT51(CONCAT41((int)((ulong)uVar15 >> 0x20),uVar115),uVar115);
  sVar70 = CONCAT11((char)uVar58,(char)uVar58);
  uVar63 = CONCAT62(uVar35,sVar70);
  auVar222._8_4_ = 0;
  auVar222._0_8_ = uVar63;
  auVar222._12_2_ = uVar116;
  auVar222._14_2_ = uVar116;
  uVar116 = (undefined2)((ulong)uVar15 >> 0x20);
  auVar221._12_4_ = auVar222._12_4_;
  auVar221._8_2_ = 0;
  auVar221._0_8_ = uVar63;
  auVar221._10_2_ = uVar116;
  auVar220._10_6_ = auVar221._10_6_;
  auVar220._8_2_ = uVar116;
  auVar220._0_8_ = uVar63;
  uVar116 = (undefined2)uVar35;
  auVar43._4_8_ = auVar220._8_8_;
  auVar43._2_2_ = uVar116;
  auVar43._0_2_ = uVar116;
  fVar258 = (float)((int)sVar70 >> 8);
  fVar261 = (float)(auVar43._0_4_ >> 0x18);
  fVar263 = (float)(auVar220._8_4_ >> 0x18);
  uVar59 = (ulong)(uint)((int)(uVar53 * 5) << 2);
  uVar58 = *(undefined4 *)(prim + uVar59 + 6);
  uVar115 = (undefined1)((uint)uVar58 >> 0x18);
  uVar116 = CONCAT11(uVar115,uVar115);
  uVar115 = (undefined1)((uint)uVar58 >> 0x10);
  uVar15 = CONCAT35(CONCAT21(uVar116,uVar115),CONCAT14(uVar115,uVar58));
  uVar115 = (undefined1)((uint)uVar58 >> 8);
  uVar35 = CONCAT51(CONCAT41((int)((ulong)uVar15 >> 0x20),uVar115),uVar115);
  sVar70 = CONCAT11((char)uVar58,(char)uVar58);
  uVar63 = CONCAT62(uVar35,sVar70);
  auVar270._8_4_ = 0;
  auVar270._0_8_ = uVar63;
  auVar270._12_2_ = uVar116;
  auVar270._14_2_ = uVar116;
  uVar116 = (undefined2)((ulong)uVar15 >> 0x20);
  auVar269._12_4_ = auVar270._12_4_;
  auVar269._8_2_ = 0;
  auVar269._0_8_ = uVar63;
  auVar269._10_2_ = uVar116;
  auVar268._10_6_ = auVar269._10_6_;
  auVar268._8_2_ = uVar116;
  auVar268._0_8_ = uVar63;
  uVar116 = (undefined2)uVar35;
  auVar44._4_8_ = auVar268._8_8_;
  auVar44._2_2_ = uVar116;
  auVar44._0_2_ = uVar116;
  fVar72 = (float)((int)sVar70 >> 8);
  fVar118 = (float)(auVar44._0_4_ >> 0x18);
  fVar120 = (float)(auVar268._8_4_ >> 0x18);
  fVar275 = fVar147 * fVar121 + fVar160 * fVar189 + fVar161 * fVar162;
  fVar276 = fVar147 * fVar145 + fVar160 * fVar199 + fVar161 * fVar173;
  fVar277 = fVar147 * fVar146 + fVar160 * fVar200 + fVar161 * fVar174;
  fVar278 = fVar147 * (float)(auVar193._12_4_ >> 0x18) +
            fVar160 * (float)(auVar74._12_4_ >> 0x18) + fVar161 * (float)(auVar77._12_4_ >> 0x18);
  fVar266 = fVar147 * fVar71 + fVar160 * fVar201 + fVar161 * fVar245;
  fVar272 = fVar147 * fVar117 + fVar160 * fVar211 + fVar161 * fVar256;
  fVar273 = fVar147 * fVar119 + fVar160 * fVar212 + fVar161 * fVar257;
  fVar274 = fVar147 * (float)(auVar80._12_4_ >> 0x18) +
            fVar160 * (float)(auVar203._12_4_ >> 0x18) + fVar161 * (float)(auVar215._12_4_ >> 0x18);
  fVar213 = fVar147 * fVar235 + fVar160 * fVar258 + fVar161 * fVar72;
  fVar233 = fVar147 * fVar243 + fVar160 * fVar261 + fVar161 * fVar118;
  fVar234 = fVar147 * fVar244 + fVar160 * fVar263 + fVar161 * fVar120;
  fVar147 = fVar147 * (float)(auVar218._12_4_ >> 0x18) +
            fVar160 * (float)(auVar221._12_4_ >> 0x18) + fVar161 * (float)(auVar269._12_4_ >> 0x18);
  uVar58 = *(undefined4 *)(ray + k * 4 + 0x30);
  fVar162 = fVar121 * fVar175 + fVar189 * fVar187 + fVar162 * fVar188;
  fVar173 = fVar145 * fVar175 + fVar199 * fVar187 + fVar173 * fVar188;
  fVar174 = fVar146 * fVar175 + fVar200 * fVar187 + fVar174 * fVar188;
  fVar189 = (float)(auVar193._12_4_ >> 0x18) * fVar175 +
            (float)(auVar74._12_4_ >> 0x18) * fVar187 + (float)(auVar77._12_4_ >> 0x18) * fVar188;
  fVar245 = fVar71 * fVar175 + fVar201 * fVar187 + fVar245 * fVar188;
  fVar211 = fVar117 * fVar175 + fVar211 * fVar187 + fVar256 * fVar188;
  fVar212 = fVar119 * fVar175 + fVar212 * fVar187 + fVar257 * fVar188;
  fVar256 = (float)(auVar80._12_4_ >> 0x18) * fVar175 +
            (float)(auVar203._12_4_ >> 0x18) * fVar187 + (float)(auVar215._12_4_ >> 0x18) * fVar188;
  fVar199 = fVar175 * fVar235 + fVar187 * fVar258 + fVar188 * fVar72;
  fVar200 = fVar175 * fVar243 + fVar187 * fVar261 + fVar188 * fVar118;
  fVar201 = fVar175 * fVar244 + fVar187 * fVar263 + fVar188 * fVar120;
  fVar175 = fVar175 * (float)(auVar218._12_4_ >> 0x18) +
            fVar187 * (float)(auVar221._12_4_ >> 0x18) + fVar188 * (float)(auVar269._12_4_ >> 0x18);
  fVar161 = (float)DAT_01ff1d40;
  fVar71 = DAT_01ff1d40._4_4_;
  fVar72 = DAT_01ff1d40._8_4_;
  fVar117 = DAT_01ff1d40._12_4_;
  uVar65 = -(uint)(fVar161 <= ABS(fVar275));
  uVar66 = -(uint)(fVar71 <= ABS(fVar276));
  uVar67 = -(uint)(fVar72 <= ABS(fVar277));
  uVar68 = -(uint)(fVar117 <= ABS(fVar278));
  auVar176._0_4_ = ~uVar65 & (uint)fVar161;
  auVar176._4_4_ = ~uVar66 & (uint)fVar71;
  auVar176._8_4_ = ~uVar67 & (uint)fVar72;
  auVar176._12_4_ = ~uVar68 & (uint)fVar117;
  auVar82._4_4_ = (uint)fVar276 & uVar66;
  auVar82._0_4_ = (uint)fVar275 & uVar65;
  auVar82._8_4_ = (uint)fVar277 & uVar67;
  auVar82._12_4_ = (uint)fVar278 & uVar68;
  auVar176 = auVar176 | auVar82;
  uVar65 = -(uint)(fVar161 <= ABS(fVar266));
  uVar66 = -(uint)(fVar71 <= ABS(fVar272));
  uVar67 = -(uint)(fVar72 <= ABS(fVar273));
  uVar68 = -(uint)(fVar117 <= ABS(fVar274));
  auVar271._0_4_ = (uint)fVar266 & uVar65;
  auVar271._4_4_ = (uint)fVar272 & uVar66;
  auVar271._8_4_ = (uint)fVar273 & uVar67;
  auVar271._12_4_ = (uint)fVar274 & uVar68;
  auVar190._0_4_ = ~uVar65 & (uint)fVar161;
  auVar190._4_4_ = ~uVar66 & (uint)fVar71;
  auVar190._8_4_ = ~uVar67 & (uint)fVar72;
  auVar190._12_4_ = ~uVar68 & (uint)fVar117;
  auVar190 = auVar190 | auVar271;
  uVar65 = -(uint)(fVar161 <= ABS(fVar213));
  uVar66 = -(uint)(fVar71 <= ABS(fVar233));
  uVar67 = -(uint)(fVar72 <= ABS(fVar234));
  uVar68 = -(uint)(fVar117 <= ABS(fVar147));
  auVar223._0_4_ = (uint)fVar213 & uVar65;
  auVar223._4_4_ = (uint)fVar233 & uVar66;
  auVar223._8_4_ = (uint)fVar234 & uVar67;
  auVar223._12_4_ = (uint)fVar147 & uVar68;
  auVar205._0_4_ = ~uVar65 & (uint)fVar161;
  auVar205._4_4_ = ~uVar66 & (uint)fVar71;
  auVar205._8_4_ = ~uVar67 & (uint)fVar72;
  auVar205._12_4_ = ~uVar68 & (uint)fVar117;
  auVar205 = auVar205 | auVar223;
  auVar82 = rcpps(_DAT_01ff1d40,auVar176);
  fVar161 = auVar82._0_4_;
  fVar117 = auVar82._4_4_;
  fVar120 = auVar82._8_4_;
  fVar146 = auVar82._12_4_;
  fVar161 = (1.0 - auVar176._0_4_ * fVar161) * fVar161 + fVar161;
  fVar117 = (1.0 - auVar176._4_4_ * fVar117) * fVar117 + fVar117;
  fVar120 = (1.0 - auVar176._8_4_ * fVar120) * fVar120 + fVar120;
  fVar146 = (1.0 - auVar176._12_4_ * fVar146) * fVar146 + fVar146;
  auVar82 = rcpps(auVar82,auVar190);
  fVar71 = auVar82._0_4_;
  fVar118 = auVar82._4_4_;
  fVar121 = auVar82._8_4_;
  fVar147 = auVar82._12_4_;
  fVar71 = (1.0 - auVar190._0_4_ * fVar71) * fVar71 + fVar71;
  fVar118 = (1.0 - auVar190._4_4_ * fVar118) * fVar118 + fVar118;
  fVar121 = (1.0 - auVar190._8_4_ * fVar121) * fVar121 + fVar121;
  fVar147 = (1.0 - auVar190._12_4_ * fVar147) * fVar147 + fVar147;
  auVar82 = rcpps(auVar82,auVar205);
  fVar72 = auVar82._0_4_;
  fVar119 = auVar82._4_4_;
  fVar145 = auVar82._8_4_;
  fVar160 = auVar82._12_4_;
  fVar72 = (1.0 - auVar205._0_4_ * fVar72) * fVar72 + fVar72;
  fVar119 = (1.0 - auVar205._4_4_ * fVar119) * fVar119 + fVar119;
  fVar145 = (1.0 - auVar205._8_4_ * fVar145) * fVar145 + fVar145;
  fVar160 = (1.0 - auVar205._12_4_ * fVar160) * fVar160 + fVar160;
  uVar63 = *(ulong *)(prim + uVar53 * 7 + 6);
  uVar116 = (undefined2)(uVar63 >> 0x30);
  auVar85._8_4_ = 0;
  auVar85._0_8_ = uVar63;
  auVar85._12_2_ = uVar116;
  auVar85._14_2_ = uVar116;
  uVar116 = (undefined2)(uVar63 >> 0x20);
  auVar84._12_4_ = auVar85._12_4_;
  auVar84._8_2_ = 0;
  auVar84._0_8_ = uVar63;
  auVar84._10_2_ = uVar116;
  auVar83._10_6_ = auVar84._10_6_;
  auVar83._8_2_ = uVar116;
  auVar83._0_8_ = uVar63;
  uVar116 = (undefined2)(uVar63 >> 0x10);
  auVar45._4_8_ = auVar83._8_8_;
  auVar45._2_2_ = uVar116;
  auVar45._0_2_ = uVar116;
  auVar177._0_8_ =
       CONCAT44(((float)(auVar45._0_4_ >> 0x10) - fVar173) * fVar117,
                ((float)(int)(short)uVar63 - fVar162) * fVar161);
  auVar177._8_4_ = ((float)(auVar83._8_4_ >> 0x10) - fVar174) * fVar120;
  auVar177._12_4_ = ((float)(auVar84._12_4_ >> 0x10) - fVar189) * fVar146;
  uVar63 = *(ulong *)(prim + uVar53 * 9 + 6);
  uVar116 = (undefined2)(uVar63 >> 0x30);
  auVar88._8_4_ = 0;
  auVar88._0_8_ = uVar63;
  auVar88._12_2_ = uVar116;
  auVar88._14_2_ = uVar116;
  uVar116 = (undefined2)(uVar63 >> 0x20);
  auVar87._12_4_ = auVar88._12_4_;
  auVar87._8_2_ = 0;
  auVar87._0_8_ = uVar63;
  auVar87._10_2_ = uVar116;
  auVar86._10_6_ = auVar87._10_6_;
  auVar86._8_2_ = uVar116;
  auVar86._0_8_ = uVar63;
  uVar116 = (undefined2)(uVar63 >> 0x10);
  auVar46._4_8_ = auVar86._8_8_;
  auVar46._2_2_ = uVar116;
  auVar46._0_2_ = uVar116;
  auVar206._0_4_ = ((float)(int)(short)uVar63 - fVar162) * fVar161;
  auVar206._4_4_ = ((float)(auVar46._0_4_ >> 0x10) - fVar173) * fVar117;
  auVar206._8_4_ = ((float)(auVar86._8_4_ >> 0x10) - fVar174) * fVar120;
  auVar206._12_4_ = ((float)(auVar87._12_4_ >> 0x10) - fVar189) * fVar146;
  uVar63 = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + 6);
  uVar57 = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar53 * -2 + 6);
  uVar116 = (undefined2)(uVar57 >> 0x30);
  auVar124._8_4_ = 0;
  auVar124._0_8_ = uVar57;
  auVar124._12_2_ = uVar116;
  auVar124._14_2_ = uVar116;
  uVar116 = (undefined2)(uVar57 >> 0x20);
  auVar123._12_4_ = auVar124._12_4_;
  auVar123._8_2_ = 0;
  auVar123._0_8_ = uVar57;
  auVar123._10_2_ = uVar116;
  auVar122._10_6_ = auVar123._10_6_;
  auVar122._8_2_ = uVar116;
  auVar122._0_8_ = uVar57;
  uVar116 = (undefined2)(uVar57 >> 0x10);
  auVar47._4_8_ = auVar122._8_8_;
  auVar47._2_2_ = uVar116;
  auVar47._0_2_ = uVar116;
  auVar125._0_8_ =
       CONCAT44(((float)(auVar47._0_4_ >> 0x10) - fVar211) * fVar118,
                ((float)(int)(short)uVar57 - fVar245) * fVar71);
  auVar125._8_4_ = ((float)(auVar122._8_4_ >> 0x10) - fVar212) * fVar121;
  auVar125._12_4_ = ((float)(auVar123._12_4_ >> 0x10) - fVar256) * fVar147;
  uVar116 = (undefined2)(uVar63 >> 0x30);
  auVar91._8_4_ = 0;
  auVar91._0_8_ = uVar63;
  auVar91._12_2_ = uVar116;
  auVar91._14_2_ = uVar116;
  uVar116 = (undefined2)(uVar63 >> 0x20);
  auVar90._12_4_ = auVar91._12_4_;
  auVar90._8_2_ = 0;
  auVar90._0_8_ = uVar63;
  auVar90._10_2_ = uVar116;
  auVar89._10_6_ = auVar90._10_6_;
  auVar89._8_2_ = uVar116;
  auVar89._0_8_ = uVar63;
  uVar116 = (undefined2)(uVar63 >> 0x10);
  auVar48._4_8_ = auVar89._8_8_;
  auVar48._2_2_ = uVar116;
  auVar48._0_2_ = uVar116;
  auVar236._0_4_ = ((float)(int)(short)uVar63 - fVar245) * fVar71;
  auVar236._4_4_ = ((float)(auVar48._0_4_ >> 0x10) - fVar211) * fVar118;
  auVar236._8_4_ = ((float)(auVar89._8_4_ >> 0x10) - fVar212) * fVar121;
  auVar236._12_4_ = ((float)(auVar90._12_4_ >> 0x10) - fVar256) * fVar147;
  uVar63 = *(ulong *)(prim + uVar59 + uVar53 + 6);
  uVar116 = (undefined2)(uVar63 >> 0x30);
  auVar94._8_4_ = 0;
  auVar94._0_8_ = uVar63;
  auVar94._12_2_ = uVar116;
  auVar94._14_2_ = uVar116;
  uVar116 = (undefined2)(uVar63 >> 0x20);
  auVar93._12_4_ = auVar94._12_4_;
  auVar93._8_2_ = 0;
  auVar93._0_8_ = uVar63;
  auVar93._10_2_ = uVar116;
  auVar92._10_6_ = auVar93._10_6_;
  auVar92._8_2_ = uVar116;
  auVar92._0_8_ = uVar63;
  uVar116 = (undefined2)(uVar63 >> 0x10);
  auVar49._4_8_ = auVar92._8_8_;
  auVar49._2_2_ = uVar116;
  auVar49._0_2_ = uVar116;
  auVar95._0_8_ =
       CONCAT44(((float)(auVar49._0_4_ >> 0x10) - fVar200) * fVar119,
                ((float)(int)(short)uVar63 - fVar199) * fVar72);
  auVar95._8_4_ = ((float)(auVar92._8_4_ >> 0x10) - fVar201) * fVar145;
  auVar95._12_4_ = ((float)(auVar93._12_4_ >> 0x10) - fVar175) * fVar160;
  uVar63 = *(ulong *)(prim + uVar53 * 0x17 + 6);
  uVar116 = (undefined2)(uVar63 >> 0x30);
  auVar226._8_4_ = 0;
  auVar226._0_8_ = uVar63;
  auVar226._12_2_ = uVar116;
  auVar226._14_2_ = uVar116;
  uVar116 = (undefined2)(uVar63 >> 0x20);
  auVar225._12_4_ = auVar226._12_4_;
  auVar225._8_2_ = 0;
  auVar225._0_8_ = uVar63;
  auVar225._10_2_ = uVar116;
  auVar224._10_6_ = auVar225._10_6_;
  auVar224._8_2_ = uVar116;
  auVar224._0_8_ = uVar63;
  uVar116 = (undefined2)(uVar63 >> 0x10);
  auVar50._4_8_ = auVar224._8_8_;
  auVar50._2_2_ = uVar116;
  auVar50._0_2_ = uVar116;
  auVar227._0_4_ = ((float)(int)(short)uVar63 - fVar199) * fVar72;
  auVar227._4_4_ = ((float)(auVar50._0_4_ >> 0x10) - fVar200) * fVar119;
  auVar227._8_4_ = ((float)(auVar224._8_4_ >> 0x10) - fVar201) * fVar145;
  auVar227._12_4_ = ((float)(auVar225._12_4_ >> 0x10) - fVar175) * fVar160;
  auVar191._8_4_ = auVar177._8_4_;
  auVar191._0_8_ = auVar177._0_8_;
  auVar191._12_4_ = auVar177._12_4_;
  auVar192 = minps(auVar191,auVar206);
  auVar148._8_4_ = auVar125._8_4_;
  auVar148._0_8_ = auVar125._0_8_;
  auVar148._12_4_ = auVar125._12_4_;
  auVar82 = minps(auVar148,auVar236);
  auVar192 = maxps(auVar192,auVar82);
  auVar149._8_4_ = auVar95._8_4_;
  auVar149._0_8_ = auVar95._0_8_;
  auVar149._12_4_ = auVar95._12_4_;
  auVar82 = minps(auVar149,auVar227);
  auVar163._4_4_ = uVar58;
  auVar163._0_4_ = uVar58;
  auVar163._8_4_ = uVar58;
  auVar163._12_4_ = uVar58;
  auVar82 = maxps(auVar82,auVar163);
  auVar193 = maxps(auVar192,auVar82);
  auVar192 = maxps(auVar177,auVar206);
  auVar82 = maxps(auVar125,auVar236);
  auVar192 = minps(auVar192,auVar82);
  local_228 = auVar193._0_4_ * 0.99999964;
  fStack_224 = auVar193._4_4_ * 0.99999964;
  fStack_220 = auVar193._8_4_ * 0.99999964;
  fStack_21c = auVar193._12_4_ * 0.99999964;
  auVar82 = maxps(auVar95,auVar227);
  uVar58 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar126._4_4_ = uVar58;
  auVar126._0_4_ = uVar58;
  auVar126._8_4_ = uVar58;
  auVar126._12_4_ = uVar58;
  auVar82 = minps(auVar82,auVar126);
  auVar82 = minps(auVar192,auVar82);
  auVar127._0_4_ = -(uint)(PVar6 != (Primitive)0x0 && local_228 <= auVar82._0_4_ * 1.0000004);
  auVar127._4_4_ = -(uint)(1 < (byte)PVar6 && fStack_224 <= auVar82._4_4_ * 1.0000004);
  auVar127._8_4_ = -(uint)(2 < (byte)PVar6 && fStack_220 <= auVar82._8_4_ * 1.0000004);
  auVar127._12_4_ = -(uint)(3 < (byte)PVar6 && fStack_21c <= auVar82._12_4_ * 1.0000004);
  uVar65 = movmskps((uint)(byte)PVar6,auVar127);
  if (uVar65 == 0) {
    return;
  }
  uVar65 = uVar65 & 0xff;
  local_208._0_12_ = mm_lookupmask_ps._240_12_;
  local_208._12_4_ = 0;
  local_410 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_358 = prim;
LAB_00b7aa06:
  local_350 = (ulong)uVar65;
  lVar62 = 0;
  if (local_350 != 0) {
    for (; (uVar65 >> lVar62 & 1) == 0; lVar62 = lVar62 + 1) {
    }
  }
  local_350 = local_350 - 1 & local_350;
  uVar65 = *(uint *)(local_358 + 2);
  local_348 = *(uint *)(local_358 + lVar62 * 4 + 6);
  local_568 = (ulong)local_348;
  pGVar7 = (context->scene->geometries).items[uVar65].ptr;
  pRVar60 = (RTCIntersectArguments *)
            pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  uVar63 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 + (long)pRVar60 * local_568);
  p_Var54 = pGVar7[1].intersectionFilterN;
  lVar62 = 0;
  if (local_350 != 0) {
    for (; (local_350 >> lVar62 & 1) == 0; lVar62 = lVar62 + 1) {
    }
  }
  lVar62 = *(long *)&pGVar7[1].time_range.upper;
  pfVar1 = (float *)(lVar62 + (long)p_Var54 * uVar63);
  pfVar2 = (float *)(lVar62 + (uVar63 + 1) * (long)p_Var54);
  pfVar3 = (float *)(lVar62 + (uVar63 + 2) * (long)p_Var54);
  pfVar4 = (float *)(lVar62 + (uVar63 + 3) * (long)p_Var54);
  if ((local_350 != 0) && (uVar63 = local_350 - 1 & local_350, uVar63 != 0)) {
    lVar61 = 0;
    if (uVar63 != 0) {
      for (; (uVar63 >> lVar61 & 1) == 0; lVar61 = lVar61 + 1) {
      }
    }
    pRVar60 = (RTCIntersectArguments *)
              ((long)pRVar60 * (ulong)*(uint *)(local_358 + lVar61 * 4 + 6));
  }
  fStack_11c = *(float *)(ray + k * 4 + 0x40);
  local_498 = *(float *)(ray + k * 4 + 0x50);
  fVar71 = *(float *)(ray + k * 4 + 0x60);
  fVar161 = local_498 * local_498;
  fVar72 = fVar71 * fVar71;
  fVar121 = fVar161 + fStack_11c * fStack_11c + fVar72;
  local_3f8._0_8_ = CONCAT44(fVar161 + fVar161 + 0.0,fVar121);
  local_3f8._8_4_ = fVar161 + fVar72 + fVar72;
  local_3f8._12_4_ = fVar161 + 0.0 + 0.0;
  auVar178._8_4_ = local_3f8._8_4_;
  auVar178._0_8_ = local_3f8._0_8_;
  auVar178._12_4_ = local_3f8._12_4_;
  auVar82 = rcpss(auVar178,local_3f8);
  local_478 = (2.0 - fVar121 * auVar82._0_4_) * auVar82._0_4_ *
              (((pfVar1[2] + pfVar2[2] + pfVar3[2] + pfVar4[2]) * 0.25 -
               *(float *)(ray + k * 4 + 0x20)) * fVar71 +
              ((pfVar1[1] + pfVar2[1] + pfVar3[1] + pfVar4[1]) * 0.25 -
              *(float *)(ray + k * 4 + 0x10)) * local_498 +
              ((*pfVar1 + *pfVar2 + *pfVar3 + *pfVar4) * 0.25 - *(float *)(ray + k * 4)) *
              fStack_11c);
  local_3e8._4_4_ = local_498;
  local_3e8._0_4_ = fStack_11c;
  fStack_3e0 = fVar71;
  fStack_3dc = 0.0;
  fStack_474 = local_478;
  fStack_470 = local_478;
  fStack_46c = local_478;
  local_1b8 = fStack_11c * local_478 + *(float *)(ray + k * 4);
  local_1c8 = local_498 * local_478 + *(float *)(ray + k * 4 + 0x10);
  local_1d8 = fVar71 * local_478 + *(float *)(ray + k * 4 + 0x20);
  fVar117 = *pfVar1 - local_1b8;
  fVar118 = pfVar1[1] - local_1c8;
  fVar119 = pfVar1[2] - local_1d8;
  fVar120 = pfVar1[3] - 0.0;
  local_198 = *pfVar3 - local_1b8;
  local_1a8 = pfVar3[1] - local_1c8;
  local_308 = pfVar3[2] - local_1d8;
  fStack_4ec = pfVar3[3] - 0.0;
  local_178 = *pfVar2 - local_1b8;
  local_188 = pfVar2[1] - local_1c8;
  local_2e8 = pfVar2[2] - local_1d8;
  fStack_4dc = pfVar2[3] - 0.0;
  local_1b8 = *pfVar4 - local_1b8;
  local_1c8 = pfVar4[1] - local_1c8;
  local_1d8 = pfVar4[2] - local_1d8;
  fStack_4fc = pfVar4[3] - 0.0;
  local_138 = fVar117;
  fStack_134 = fVar117;
  fStack_130 = fVar117;
  fStack_12c = fVar117;
  local_148 = fVar118;
  fStack_144 = fVar118;
  fStack_140 = fVar118;
  fStack_13c = fVar118;
  local_158 = fVar119;
  fStack_154 = fVar119;
  fStack_150 = fVar119;
  fStack_14c = fVar119;
  local_168 = fVar120;
  fStack_164 = fVar120;
  fStack_160 = fVar120;
  fStack_15c = fVar120;
  fStack_174 = local_178;
  fStack_170 = local_178;
  fStack_16c = local_178;
  fStack_184 = local_188;
  fStack_180 = local_188;
  fStack_17c = local_188;
  fStack_2e4 = local_2e8;
  fStack_2e0 = local_2e8;
  fStack_2dc = local_2e8;
  fVar161 = local_498 * local_498;
  local_4e8 = local_178;
  fStack_4e4 = local_188;
  fStack_4e0 = local_2e8;
  local_2f8 = fStack_4dc;
  fStack_2f4 = fStack_4dc;
  fStack_2f0 = fStack_4dc;
  fStack_2ec = fStack_4dc;
  fStack_11c = fStack_11c * fStack_11c;
  local_128 = fStack_11c + fVar161 + fVar72;
  fStack_124 = fStack_11c + fVar161 + fVar72;
  fStack_120 = fStack_11c + fVar161 + fVar72;
  fStack_11c = fStack_11c + fVar161 + fVar72;
  fStack_194 = local_198;
  fStack_190 = local_198;
  fStack_18c = local_198;
  fStack_1a4 = local_1a8;
  fStack_1a0 = local_1a8;
  fStack_19c = local_1a8;
  fStack_304 = local_308;
  fStack_300 = local_308;
  fStack_2fc = local_308;
  local_4f8 = local_198;
  fStack_4f4 = local_1a8;
  fStack_4f0 = local_308;
  local_318 = fStack_4ec;
  fStack_314 = fStack_4ec;
  fStack_310 = fStack_4ec;
  fStack_30c = fStack_4ec;
  fStack_1b4 = local_1b8;
  fStack_1b0 = local_1b8;
  fStack_1ac = local_1b8;
  fStack_1c4 = local_1c8;
  fStack_1c0 = local_1c8;
  fStack_1bc = local_1c8;
  fStack_1d4 = local_1d8;
  fStack_1d0 = local_1d8;
  fStack_1cc = local_1d8;
  local_508 = local_1b8;
  fStack_504 = local_1c8;
  fStack_500 = local_1d8;
  local_1e8 = fStack_4fc;
  fStack_1e4 = fStack_4fc;
  fStack_1e0 = fStack_4fc;
  fStack_1dc = fStack_4fc;
  local_408 = *(float *)(ray + k * 4 + 0x40);
  local_328 = ABS(local_128);
  fStack_324 = ABS(fStack_124);
  fStack_320 = ABS(fStack_120);
  fStack_31c = ABS(fStack_11c);
  fVar161 = *(float *)(ray + k * 4 + 0x30);
  local_388 = ZEXT416((uint)local_478);
  local_1f8 = fVar161 - local_478;
  fStack_1f4 = local_1f8;
  fStack_1f0 = local_1f8;
  fStack_1ec = local_1f8;
  local_338 = uVar65;
  uStack_334 = uVar65;
  uStack_330 = uVar65;
  uStack_32c = uVar65;
  uStack_344 = local_348;
  uStack_340 = local_348;
  uStack_33c = local_348;
  local_560 = 1;
  uVar57 = 0;
  local_4a8 = 0.0;
  fStack_4a4 = 1.0;
  uStack_4a0 = 0;
  uStack_49c = 0;
  fStack_494 = local_498;
  fStack_490 = local_498;
  fStack_48c = local_498;
  fStack_404 = local_408;
  fStack_400 = local_408;
  fStack_3fc = local_408;
  uVar63 = 1;
  do {
    local_448 = fStack_4a4 - local_4a8;
    fStack_444 = local_448;
    fStack_440 = local_448;
    fStack_43c = local_448;
    local_458._4_4_ = local_4a8;
    local_458._0_4_ = local_4a8;
    fStack_450 = local_4a8;
    fStack_44c = local_4a8;
    fVar160 = local_448 * 0.0 + local_4a8;
    fVar162 = local_448 * 0.33333334 + local_4a8;
    fVar173 = local_448 * 0.6666667 + local_4a8;
    fVar174 = local_448 * 1.0 + local_4a8;
    fVar189 = 1.0 - fVar160;
    fVar199 = 1.0 - fVar162;
    fVar200 = 1.0 - fVar173;
    fVar201 = 1.0 - fVar174;
    fVar274 = local_178 * fVar189 + local_198 * fVar160;
    fVar275 = fStack_174 * fVar199 + fStack_194 * fVar162;
    fVar276 = fStack_170 * fVar200 + fStack_190 * fVar173;
    fVar277 = fStack_16c * fVar201 + fStack_18c * fVar174;
    fVar278 = local_188 * fVar189 + local_1a8 * fVar160;
    fVar262 = fStack_184 * fVar199 + fStack_1a4 * fVar162;
    fVar264 = fStack_180 * fVar200 + fStack_1a0 * fVar173;
    fVar265 = fStack_17c * fVar201 + fStack_19c * fVar174;
    fVar212 = local_2e8 * fVar189 + local_308 * fVar160;
    fVar213 = fStack_2e4 * fVar199 + fStack_304 * fVar162;
    fVar233 = fStack_2e0 * fVar200 + fStack_300 * fVar173;
    fVar234 = fStack_2dc * fVar201 + fStack_2fc * fVar174;
    fVar263 = local_2f8 * fVar189 + local_318 * fVar160;
    fVar266 = fStack_2f4 * fVar199 + fStack_314 * fVar162;
    fVar272 = fStack_2f0 * fVar200 + fStack_310 * fVar173;
    fVar273 = fStack_2ec * fVar201 + fStack_30c * fVar174;
    fVar175 = (local_138 * fVar189 + local_178 * fVar160) * fVar189 + fVar160 * fVar274;
    fVar187 = (fStack_134 * fVar199 + fStack_174 * fVar162) * fVar199 + fVar162 * fVar275;
    fVar188 = (fStack_130 * fVar200 + fStack_170 * fVar173) * fVar200 + fVar173 * fVar276;
    fVar211 = (fStack_12c * fVar201 + fStack_16c * fVar174) * fVar201 + fVar174 * fVar277;
    fVar72 = (local_148 * fVar189 + local_188 * fVar160) * fVar189 + fVar160 * fVar278;
    fVar145 = (fStack_144 * fVar199 + fStack_184 * fVar162) * fVar199 + fVar162 * fVar262;
    fVar146 = (fStack_140 * fVar200 + fStack_180 * fVar173) * fVar200 + fVar173 * fVar264;
    fVar147 = (fStack_13c * fVar201 + fStack_17c * fVar174) * fVar201 + fVar174 * fVar265;
    fVar235 = (local_158 * fVar189 + local_2e8 * fVar160) * fVar189 + fVar160 * fVar212;
    fVar243 = (fStack_154 * fVar199 + fStack_2e4 * fVar162) * fVar199 + fVar162 * fVar213;
    fVar244 = (fStack_150 * fVar200 + fStack_2e0 * fVar173) * fVar200 + fVar173 * fVar233;
    fVar245 = (fStack_14c * fVar201 + fStack_2dc * fVar174) * fVar201 + fVar174 * fVar234;
    fVar256 = (local_168 * fVar189 + local_2f8 * fVar160) * fVar189 + fVar160 * fVar263;
    fVar257 = (fStack_164 * fVar199 + fStack_2f4 * fVar162) * fVar199 + fVar162 * fVar266;
    fVar258 = (fStack_160 * fVar200 + fStack_2f0 * fVar173) * fVar200 + fVar173 * fVar272;
    fVar261 = (fStack_15c * fVar201 + fStack_2ec * fVar174) * fVar201 + fVar174 * fVar273;
    fVar274 = fVar274 * fVar189 + (local_198 * fVar189 + local_1b8 * fVar160) * fVar160;
    fVar275 = fVar275 * fVar199 + (fStack_194 * fVar199 + fStack_1b4 * fVar162) * fVar162;
    fVar276 = fVar276 * fVar200 + (fStack_190 * fVar200 + fStack_1b0 * fVar173) * fVar173;
    fVar277 = fVar277 * fVar201 + (fStack_18c * fVar201 + fStack_1ac * fVar174) * fVar174;
    fVar278 = fVar278 * fVar189 + (local_1a8 * fVar189 + local_1c8 * fVar160) * fVar160;
    fVar262 = fVar262 * fVar199 + (fStack_1a4 * fVar199 + fStack_1c4 * fVar162) * fVar162;
    fVar264 = fVar264 * fVar200 + (fStack_1a0 * fVar200 + fStack_1c0 * fVar173) * fVar173;
    fVar265 = fVar265 * fVar201 + (fStack_19c * fVar201 + fStack_1bc * fVar174) * fVar174;
    fVar212 = fVar212 * fVar189 + (local_308 * fVar189 + local_1d8 * fVar160) * fVar160;
    fVar213 = fVar213 * fVar199 + (fStack_304 * fVar199 + fStack_1d4 * fVar162) * fVar162;
    fVar233 = fVar233 * fVar200 + (fStack_300 * fVar200 + fStack_1d0 * fVar173) * fVar173;
    fVar234 = fVar234 * fVar201 + (fStack_2fc * fVar201 + fStack_1cc * fVar174) * fVar174;
    fVar263 = fVar263 * fVar189 + (local_318 * fVar189 + local_1e8 * fVar160) * fVar160;
    fVar266 = fVar266 * fVar199 + (fStack_314 * fVar199 + fStack_1e4 * fVar162) * fVar162;
    fVar272 = fVar272 * fVar200 + (fStack_310 * fVar200 + fStack_1e0 * fVar173) * fVar173;
    fVar273 = fVar273 * fVar201 + (fStack_30c * fVar201 + fStack_1dc * fVar174) * fVar174;
    fVar279 = fVar189 * fVar175 + fVar160 * fVar274;
    fVar282 = fVar199 * fVar187 + fVar162 * fVar275;
    fVar283 = fVar200 * fVar188 + fVar173 * fVar276;
    fVar284 = fVar201 * fVar211 + fVar174 * fVar277;
    fVar285 = fVar189 * fVar72 + fVar160 * fVar278;
    fVar286 = fVar199 * fVar145 + fVar162 * fVar262;
    fVar287 = fVar200 * fVar146 + fVar173 * fVar264;
    fVar288 = fVar201 * fVar147 + fVar174 * fVar265;
    local_518 = fVar189 * fVar235 + fVar160 * fVar212;
    fStack_514 = fVar199 * fVar243 + fVar162 * fVar213;
    fStack_510 = fVar200 * fVar244 + fVar173 * fVar233;
    fStack_50c = fVar201 * fVar245 + fVar174 * fVar234;
    fVar267 = local_448 * 0.11111111;
    fVar160 = fVar189 * fVar256 + fVar160 * fVar263;
    fVar162 = fVar199 * fVar257 + fVar162 * fVar266;
    auVar150._0_8_ = CONCAT44(fVar162,fVar160);
    auVar150._8_4_ = fVar200 * fVar258 + fVar173 * fVar272;
    auVar150._12_4_ = fVar201 * fVar261 + fVar174 * fVar273;
    fVar274 = (fVar274 - fVar175) * 3.0 * fVar267;
    fVar275 = (fVar275 - fVar187) * 3.0 * fVar267;
    fVar276 = (fVar276 - fVar188) * 3.0 * fVar267;
    fVar277 = (fVar277 - fVar211) * 3.0 * fVar267;
    fVar278 = (fVar278 - fVar72) * 3.0 * fVar267;
    local_428 = (fVar262 - fVar145) * 3.0 * fVar267;
    fStack_424 = (fVar264 - fVar146) * 3.0 * fVar267;
    fStack_420 = (fVar265 - fVar147) * 3.0 * fVar267;
    fVar189 = (fVar212 - fVar235) * 3.0 * fVar267;
    local_438 = (fVar213 - fVar243) * 3.0 * fVar267;
    fStack_434 = (fVar233 - fVar244) * 3.0 * fVar267;
    fStack_430 = (fVar234 - fVar245) * 3.0 * fVar267;
    fVar72 = fVar267 * (fVar266 - fVar257) * 3.0;
    fVar145 = fVar267 * (fVar272 - fVar258) * 3.0;
    fVar146 = fVar267 * (fVar273 - fVar261) * 3.0;
    auVar128._4_4_ = auVar150._8_4_;
    auVar128._0_4_ = fVar162;
    auVar128._8_4_ = auVar150._12_4_;
    auVar128._12_4_ = 0;
    local_658._4_4_ = fVar162 + fVar72;
    local_658._0_4_ = fVar160 + fVar267 * (fVar263 - fVar256) * 3.0;
    fStack_650 = auVar150._8_4_ + fVar145;
    fStack_64c = auVar150._12_4_ + fVar146;
    auVar129._0_8_ = CONCAT44(auVar150._8_4_ - fVar145,fVar162 - fVar72);
    auVar129._8_4_ = auVar150._12_4_ - fVar146;
    auVar129._12_4_ = 0;
    local_488 = fVar286 - fVar285;
    fStack_484 = fVar287 - fVar286;
    fStack_480 = fVar288 - fVar287;
    fStack_47c = 0.0 - fVar288;
    local_4b8._0_4_ = fStack_514 - local_518;
    local_4b8._4_4_ = fStack_510 - fStack_514;
    fStack_4b0 = fStack_50c - fStack_510;
    fStack_4ac = 0.0 - fStack_50c;
    fVar72 = fVar278 * (float)local_4b8._0_4_ - fVar189 * local_488;
    fVar145 = local_428 * (float)local_4b8._4_4_ - local_438 * fStack_484;
    fVar146 = fStack_424 * fStack_4b0 - fStack_434 * fStack_480;
    fVar147 = fStack_420 * fStack_4ac - fStack_430 * fStack_47c;
    local_4c8._0_4_ = fVar282 - fVar279;
    local_4c8._4_4_ = fVar283 - fVar282;
    fStack_4c0 = fVar284 - fVar283;
    fStack_4bc = 0.0 - fVar284;
    fVar160 = fVar189 * (float)local_4c8._0_4_ - fVar274 * (float)local_4b8._0_4_;
    fVar173 = local_438 * (float)local_4c8._4_4_ - fVar275 * (float)local_4b8._4_4_;
    fVar199 = fStack_434 * fStack_4c0 - fVar276 * fStack_4b0;
    fVar201 = fStack_430 * fStack_4bc - fVar277 * fStack_4ac;
    fVar162 = fVar274 * local_488 - fVar278 * (float)local_4c8._0_4_;
    fVar174 = fVar275 * fStack_484 - local_428 * (float)local_4c8._4_4_;
    fVar200 = fVar276 * fStack_480 - fStack_424 * fStack_4c0;
    fVar175 = fVar277 * fStack_47c - fStack_420 * fStack_4bc;
    auVar228._0_4_ = fVar162 * fVar162;
    auVar228._4_4_ = fVar174 * fVar174;
    auVar228._8_4_ = fVar200 * fVar200;
    auVar228._12_4_ = fVar175 * fVar175;
    auVar164._0_4_ =
         (float)local_4c8._0_4_ * (float)local_4c8._0_4_ +
         local_488 * local_488 + (float)local_4b8._0_4_ * (float)local_4b8._0_4_;
    auVar164._4_4_ =
         (float)local_4c8._4_4_ * (float)local_4c8._4_4_ +
         fStack_484 * fStack_484 + (float)local_4b8._4_4_ * (float)local_4b8._4_4_;
    auVar164._8_4_ = fStack_4c0 * fStack_4c0 + fStack_480 * fStack_480 + fStack_4b0 * fStack_4b0;
    auVar164._12_4_ = fStack_4bc * fStack_4bc + fStack_47c * fStack_47c + fStack_4ac * fStack_4ac;
    auVar82 = rcpps(auVar228,auVar164);
    fVar162 = auVar82._0_4_;
    fVar174 = auVar82._4_4_;
    fVar200 = auVar82._8_4_;
    fVar175 = auVar82._12_4_;
    fVar162 = (1.0 - fVar162 * auVar164._0_4_) * fVar162 + fVar162;
    fVar174 = (1.0 - fVar174 * auVar164._4_4_) * fVar174 + fVar174;
    fVar200 = (1.0 - fVar200 * auVar164._8_4_) * fVar200 + fVar200;
    fVar175 = (1.0 - fVar175 * auVar164._12_4_) * fVar175 + fVar175;
    fVar187 = (float)local_4b8._0_4_ * local_428 - local_488 * local_438;
    fVar188 = (float)local_4b8._4_4_ * fStack_424 - fStack_484 * fStack_434;
    fVar211 = fStack_4b0 * fStack_420 - fStack_480 * fStack_430;
    fVar212 = fStack_4ac * 0.0 - fStack_47c * 0.0;
    uStack_42c = 0;
    fVar213 = (float)local_4c8._0_4_ * local_438 - (float)local_4b8._0_4_ * fVar275;
    fVar233 = (float)local_4c8._4_4_ * fStack_434 - (float)local_4b8._4_4_ * fVar276;
    fVar234 = fStack_4c0 * fStack_430 - fStack_4b0 * fVar277;
    fVar235 = fStack_4bc * 0.0 - fStack_4ac * 0.0;
    fStack_41c = 0.0;
    fVar243 = local_488 * fVar275 - (float)local_4c8._0_4_ * local_428;
    fVar244 = fStack_484 * fVar276 - (float)local_4c8._4_4_ * fStack_424;
    fVar245 = fStack_480 * fVar277 - fStack_4c0 * fStack_420;
    fVar256 = fStack_47c * 0.0 - fStack_4bc * 0.0;
    auVar280._0_4_ = fVar243 * fVar243;
    auVar280._4_4_ = fVar244 * fVar244;
    auVar280._8_4_ = fVar245 * fVar245;
    auVar280._12_4_ = fVar256 * fVar256;
    auVar96._0_4_ = (fVar72 * fVar72 + fVar160 * fVar160 + auVar228._0_4_) * fVar162;
    auVar96._4_4_ = (fVar145 * fVar145 + fVar173 * fVar173 + auVar228._4_4_) * fVar174;
    auVar96._8_4_ = (fVar146 * fVar146 + fVar199 * fVar199 + auVar228._8_4_) * fVar200;
    auVar96._12_4_ = (fVar147 * fVar147 + fVar201 * fVar201 + auVar228._12_4_) * fVar175;
    auVar237._0_4_ = (fVar187 * fVar187 + fVar213 * fVar213 + auVar280._0_4_) * fVar162;
    auVar237._4_4_ = (fVar188 * fVar188 + fVar233 * fVar233 + auVar280._4_4_) * fVar174;
    auVar237._8_4_ = (fVar211 * fVar211 + fVar234 * fVar234 + auVar280._8_4_) * fVar200;
    auVar237._12_4_ = (fVar212 * fVar212 + fVar235 * fVar235 + auVar280._12_4_) * fVar175;
    auVar82 = maxps(auVar96,auVar237);
    auVar229._8_4_ = auVar150._8_4_;
    auVar229._0_8_ = auVar150._0_8_;
    auVar229._12_4_ = auVar150._12_4_;
    auVar193 = maxps(auVar229,_local_658);
    auVar194._8_4_ = auVar129._8_4_;
    auVar194._0_8_ = auVar129._0_8_;
    auVar194._12_4_ = 0;
    auVar192 = maxps(auVar194,auVar128);
    auVar230 = maxps(auVar193,auVar192);
    auVar193 = minps(auVar150,_local_658);
    auVar192 = minps(auVar129,auVar128);
    auVar192 = minps(auVar193,auVar192);
    auVar82 = sqrtps(auVar82,auVar82);
    auVar193 = rsqrtps(auVar280,auVar164);
    fVar72 = auVar193._0_4_;
    fVar145 = auVar193._4_4_;
    fVar146 = auVar193._8_4_;
    fVar147 = auVar193._12_4_;
    local_218 = fVar72 * fVar72 * auVar164._0_4_ * -0.5 * fVar72 + fVar72 * 1.5;
    fStack_214 = fVar145 * fVar145 * auVar164._4_4_ * -0.5 * fVar145 + fVar145 * 1.5;
    fStack_210 = fVar146 * fVar146 * auVar164._8_4_ * -0.5 * fVar146 + fVar146 * 1.5;
    fStack_20c = fVar147 * fVar147 * auVar164._12_4_ * -0.5 * fVar147 + fVar147 * 1.5;
    fVar72 = 0.0 - fVar285;
    fVar145 = 0.0 - fVar286;
    fVar146 = 0.0 - fVar287;
    fVar147 = 0.0 - fVar288;
    fVar187 = 0.0 - local_518;
    fVar188 = 0.0 - fStack_514;
    fVar211 = 0.0 - fStack_510;
    fVar212 = 0.0 - fStack_50c;
    fVar243 = 0.0 - fVar279;
    fVar244 = 0.0 - fVar282;
    fVar245 = 0.0 - fVar283;
    fVar256 = 0.0 - fVar284;
    local_398._0_4_ =
         local_408 * (float)local_4c8._0_4_ * local_218 +
         local_498 * local_488 * local_218 + fVar71 * (float)local_4b8._0_4_ * local_218;
    local_398._4_4_ =
         fStack_404 * (float)local_4c8._4_4_ * fStack_214 +
         fStack_494 * fStack_484 * fStack_214 + fVar71 * (float)local_4b8._4_4_ * fStack_214;
    fStack_390 = fStack_400 * fStack_4c0 * fStack_210 +
                 fStack_490 * fStack_480 * fStack_210 + fVar71 * fStack_4b0 * fStack_210;
    fStack_38c = fStack_3fc * fStack_4bc * fStack_20c +
                 fStack_48c * fStack_47c * fStack_20c + fVar71 * fStack_4ac * fStack_20c;
    local_3b8 = (float)local_4c8._0_4_ * local_218 * fVar243 +
                local_488 * local_218 * fVar72 + (float)local_4b8._0_4_ * local_218 * fVar187;
    fStack_3b4 = (float)local_4c8._4_4_ * fStack_214 * fVar244 +
                 fStack_484 * fStack_214 * fVar145 + (float)local_4b8._4_4_ * fStack_214 * fVar188;
    fStack_3b0 = fStack_4c0 * fStack_210 * fVar245 +
                 fStack_480 * fStack_210 * fVar146 + fStack_4b0 * fStack_210 * fVar211;
    fStack_3ac = fStack_4bc * fStack_20c * fVar256 +
                 fStack_47c * fStack_20c * fVar147 + fStack_4ac * fStack_20c * fVar212;
    fVar213 = (local_408 * fVar243 + local_498 * fVar72 + fVar71 * fVar187) -
              (float)local_398._0_4_ * local_3b8;
    fVar233 = (fStack_404 * fVar244 + fStack_494 * fVar145 + fVar71 * fVar188) -
              (float)local_398._4_4_ * fStack_3b4;
    fVar234 = (fStack_400 * fVar245 + fStack_490 * fVar146 + fVar71 * fVar211) -
              fStack_390 * fStack_3b0;
    fVar235 = (fStack_3fc * fVar256 + fStack_48c * fVar147 + fVar71 * fVar212) -
              fStack_38c * fStack_3ac;
    fVar199 = (fVar243 * fVar243 + fVar72 * fVar72 + fVar187 * fVar187) - local_3b8 * local_3b8;
    fVar200 = (fVar244 * fVar244 + fVar145 * fVar145 + fVar188 * fVar188) - fStack_3b4 * fStack_3b4;
    fVar201 = (fVar245 * fVar245 + fVar146 * fVar146 + fVar211 * fVar211) - fStack_3b0 * fStack_3b0;
    fVar175 = (fVar256 * fVar256 + fVar147 * fVar147 + fVar212 * fVar212) - fStack_3ac * fStack_3ac;
    fVar160 = (auVar230._0_4_ + auVar82._0_4_) * 1.0000002;
    fVar162 = (auVar230._4_4_ + auVar82._4_4_) * 1.0000002;
    fVar173 = (auVar230._8_4_ + auVar82._8_4_) * 1.0000002;
    fVar174 = (auVar230._12_4_ + auVar82._12_4_) * 1.0000002;
    auVar195._0_4_ = fVar199 - fVar160 * fVar160;
    auVar195._4_4_ = fVar200 - fVar162 * fVar162;
    auVar195._8_4_ = fVar201 - fVar173 * fVar173;
    auVar195._12_4_ = fVar175 - fVar174 * fVar174;
    local_3a8._0_4_ = (float)local_398._0_4_ * (float)local_398._0_4_;
    local_3a8._4_4_ = (float)local_398._4_4_ * (float)local_398._4_4_;
    fStack_3a0 = fStack_390 * fStack_390;
    fStack_39c = fStack_38c * fStack_38c;
    fVar160 = local_128 - (float)local_3a8._0_4_;
    fVar162 = fStack_124 - (float)local_3a8._4_4_;
    fVar173 = fStack_120 - fStack_3a0;
    fVar174 = fStack_11c - fStack_39c;
    local_528._0_4_ = fVar213 + fVar213;
    local_528._4_4_ = fVar233 + fVar233;
    fStack_520 = fVar234 + fVar234;
    fStack_51c = fVar235 + fVar235;
    local_4d8._0_4_ = fVar160 * 4.0;
    local_4d8._4_4_ = fVar162 * 4.0;
    fStack_4d0 = fVar173 * 4.0;
    fStack_4cc = fVar174 * 4.0;
    auVar231._0_4_ =
         (float)local_528._0_4_ * (float)local_528._0_4_ - (float)local_4d8._0_4_ * auVar195._0_4_;
    auVar231._4_4_ =
         (float)local_528._4_4_ * (float)local_528._4_4_ - (float)local_4d8._4_4_ * auVar195._4_4_;
    auVar231._8_4_ = fStack_520 * fStack_520 - fStack_4d0 * auVar195._8_4_;
    auVar231._12_4_ = fStack_51c * fStack_51c - fStack_4cc * auVar195._12_4_;
    local_468 = (auVar192._0_4_ - auVar82._0_4_) * 0.99999976;
    fStack_464 = (auVar192._4_4_ - auVar82._4_4_) * 0.99999976;
    fStack_460 = (auVar192._8_4_ - auVar82._8_4_) * 0.99999976;
    fStack_45c = (auVar192._12_4_ - auVar82._12_4_) * 0.99999976;
    auVar179._4_4_ = -(uint)(0.0 <= auVar231._4_4_);
    auVar179._0_4_ = -(uint)(0.0 <= auVar231._0_4_);
    auVar179._8_4_ = -(uint)(0.0 <= auVar231._8_4_);
    auVar179._12_4_ = -(uint)(0.0 <= auVar231._12_4_);
    uVar58 = 0;
    iVar51 = movmskps((int)uVar63,auVar179);
    if (iVar51 == 0) {
      iVar51 = 0;
      auVar131 = _DAT_01feb9f0;
      auVar197 = _DAT_01feba00;
    }
    else {
      auVar192 = sqrtps(_local_528,auVar231);
      bVar8 = 0.0 <= auVar231._0_4_;
      uVar66 = -(uint)bVar8;
      bVar64 = 0.0 <= auVar231._4_4_;
      uVar67 = -(uint)bVar64;
      bVar9 = 0.0 <= auVar231._8_4_;
      uVar68 = -(uint)bVar9;
      bVar10 = 0.0 <= auVar231._12_4_;
      uVar69 = -(uint)bVar10;
      auVar130._0_4_ = fVar160 + fVar160;
      auVar130._4_4_ = fVar162 + fVar162;
      auVar130._8_4_ = fVar173 + fVar173;
      auVar130._12_4_ = fVar174 + fVar174;
      auVar82 = rcpps(auVar195,auVar130);
      fVar213 = auVar82._0_4_;
      fVar234 = auVar82._4_4_;
      fVar257 = auVar82._8_4_;
      fVar261 = auVar82._12_4_;
      fVar213 = (1.0 - auVar130._0_4_ * fVar213) * fVar213 + fVar213;
      fVar234 = (1.0 - auVar130._4_4_ * fVar234) * fVar234 + fVar234;
      fVar257 = (1.0 - auVar130._8_4_ * fVar257) * fVar257 + fVar257;
      fVar261 = (1.0 - auVar130._12_4_ * fVar261) * fVar261 + fVar261;
      fVar233 = (-(float)local_528._0_4_ - auVar192._0_4_) * fVar213;
      fVar235 = (-(float)local_528._4_4_ - auVar192._4_4_) * fVar234;
      fVar258 = (-fStack_520 - auVar192._8_4_) * fVar257;
      fVar263 = (-fStack_51c - auVar192._12_4_) * fVar261;
      fVar213 = (auVar192._0_4_ - (float)local_528._0_4_) * fVar213;
      fVar234 = (auVar192._4_4_ - (float)local_528._4_4_) * fVar234;
      fVar257 = (auVar192._8_4_ - fStack_520) * fVar257;
      fVar261 = (auVar192._12_4_ - fStack_51c) * fVar261;
      local_368[0] = ((float)local_398._0_4_ * fVar233 + local_3b8) * local_218;
      local_368[1] = ((float)local_398._4_4_ * fVar235 + fStack_3b4) * fStack_214;
      local_368[2] = (fStack_390 * fVar258 + fStack_3b0) * fStack_210;
      local_368[3] = (fStack_38c * fVar263 + fStack_3ac) * fStack_20c;
      local_378[0] = ((float)local_398._0_4_ * fVar213 + local_3b8) * local_218;
      local_378[1] = ((float)local_398._4_4_ * fVar234 + fStack_3b4) * fStack_214;
      local_378[2] = (fStack_390 * fVar257 + fStack_3b0) * fStack_210;
      local_378[3] = (fStack_38c * fVar261 + fStack_3ac) * fStack_20c;
      auVar196._0_4_ = (uint)fVar233 & uVar66;
      auVar196._4_4_ = (uint)fVar235 & uVar67;
      auVar196._8_4_ = (uint)fVar258 & uVar68;
      auVar196._12_4_ = (uint)fVar263 & uVar69;
      auVar131._0_8_ = CONCAT44(~uVar67,~uVar66) & 0x7f8000007f800000;
      auVar131._8_4_ = ~uVar68 & 0x7f800000;
      auVar131._12_4_ = ~uVar69 & 0x7f800000;
      auVar131 = auVar131 | auVar196;
      auVar238._0_4_ = (uint)fVar213 & uVar66;
      auVar238._4_4_ = (uint)fVar234 & uVar67;
      auVar238._8_4_ = (uint)fVar257 & uVar68;
      auVar238._12_4_ = (uint)fVar261 & uVar69;
      auVar197._0_8_ = CONCAT44(~uVar67,~uVar66) & 0xff800000ff800000;
      auVar197._8_4_ = ~uVar68 & 0xff800000;
      auVar197._12_4_ = ~uVar69 & 0xff800000;
      auVar197 = auVar197 | auVar238;
      auVar239._0_8_ = CONCAT44(local_3a8._4_4_,local_3a8._0_4_) & 0x7fffffff7fffffff;
      auVar239._8_4_ = ABS(fStack_3a0);
      auVar239._12_4_ = ABS(fStack_39c);
      auVar32._4_4_ = fStack_324;
      auVar32._0_4_ = local_328;
      auVar32._8_4_ = fStack_320;
      auVar32._12_4_ = fStack_31c;
      auVar82 = maxps(auVar32,auVar239);
      fVar213 = auVar82._0_4_ * 1.9073486e-06;
      fVar233 = auVar82._4_4_ * 1.9073486e-06;
      fVar234 = auVar82._8_4_ * 1.9073486e-06;
      fVar235 = auVar82._12_4_ * 1.9073486e-06;
      auVar240._0_4_ = -(uint)(ABS(fVar160) < fVar213 && bVar8);
      auVar240._4_4_ = -(uint)(ABS(fVar162) < fVar233 && bVar64);
      auVar240._8_4_ = -(uint)(ABS(fVar173) < fVar234 && bVar9);
      auVar240._12_4_ = -(uint)(ABS(fVar174) < fVar235 && bVar10);
      iVar51 = movmskps(iVar51,auVar240);
      if (iVar51 != 0) {
        uVar66 = -(uint)(auVar195._0_4_ <= 0.0);
        uVar67 = -(uint)(auVar195._4_4_ <= 0.0);
        uVar68 = -(uint)(auVar195._8_4_ <= 0.0);
        uVar69 = -(uint)(auVar195._12_4_ <= 0.0);
        auVar281._0_4_ = (uVar66 & 0xff800000 | ~uVar66 & 0x7f800000) & auVar240._0_4_;
        auVar281._4_4_ = (uVar67 & 0xff800000 | ~uVar67 & 0x7f800000) & auVar240._4_4_;
        auVar281._8_4_ = (uVar68 & 0xff800000 | ~uVar68 & 0x7f800000) & auVar240._8_4_;
        auVar281._12_4_ = (uVar69 & 0xff800000 | ~uVar69 & 0x7f800000) & auVar240._12_4_;
        auVar207._0_4_ = ~auVar240._0_4_ & auVar131._0_4_;
        auVar207._4_4_ = ~auVar240._4_4_ & auVar131._4_4_;
        auVar207._8_4_ = ~auVar240._8_4_ & auVar131._8_4_;
        auVar207._12_4_ = ~auVar240._12_4_ & auVar131._12_4_;
        auVar180._0_4_ = (uVar66 & 0x7f800000 | ~uVar66 & 0xff800000) & auVar240._0_4_;
        auVar180._4_4_ = (uVar67 & 0x7f800000 | ~uVar67 & 0xff800000) & auVar240._4_4_;
        auVar180._8_4_ = (uVar68 & 0x7f800000 | ~uVar68 & 0xff800000) & auVar240._8_4_;
        auVar180._12_4_ = (uVar69 & 0x7f800000 | ~uVar69 & 0xff800000) & auVar240._12_4_;
        auVar241._0_4_ = ~auVar240._0_4_ & auVar197._0_4_;
        auVar241._4_4_ = ~auVar240._4_4_ & auVar197._4_4_;
        auVar241._8_4_ = ~auVar240._8_4_ & auVar197._8_4_;
        auVar241._12_4_ = ~auVar240._12_4_ & auVar197._12_4_;
        auVar179._4_4_ = -(uint)((fVar233 <= ABS(fVar162) || auVar195._4_4_ <= 0.0) && bVar64);
        auVar179._0_4_ = -(uint)((fVar213 <= ABS(fVar160) || auVar195._0_4_ <= 0.0) && bVar8);
        auVar179._8_4_ = -(uint)((fVar234 <= ABS(fVar173) || auVar195._8_4_ <= 0.0) && bVar9);
        auVar179._12_4_ = -(uint)((fVar235 <= ABS(fVar174) || auVar195._12_4_ <= 0.0) && bVar10);
        auVar131 = auVar207 | auVar281;
        auVar197 = auVar241 | auVar180;
      }
    }
    auVar181._0_4_ = (auVar179._0_4_ << 0x1f) >> 0x1f;
    auVar181._4_4_ = (auVar179._4_4_ << 0x1f) >> 0x1f;
    auVar181._8_4_ = (auVar179._8_4_ << 0x1f) >> 0x1f;
    auVar181._12_4_ = (auVar179._12_4_ << 0x1f) >> 0x1f;
    auVar181 = auVar181 & local_208;
    iVar51 = movmskps(iVar51,auVar181);
    if (iVar51 != 0) {
      auVar151._0_4_ = *(float *)(ray + k * 4 + 0x80) - (float)local_388._0_4_;
      auVar151._4_4_ = auVar151._0_4_;
      auVar151._8_4_ = auVar151._0_4_;
      auVar151._12_4_ = auVar151._0_4_;
      auVar192 = minps(auVar151,auVar197);
      auVar34._4_4_ = fStack_1f4;
      auVar34._0_4_ = local_1f8;
      auVar34._8_4_ = fStack_1f0;
      auVar34._12_4_ = fStack_1ec;
      auVar193 = maxps(auVar34,auVar131);
      auVar97._0_4_ = fVar72 * fVar278 + fVar187 * fVar189;
      auVar97._4_4_ = fVar145 * local_428 + fVar188 * local_438;
      auVar97._8_4_ = fVar146 * fStack_424 + fVar211 * fStack_434;
      auVar97._12_4_ = fVar147 * fStack_420 + fVar212 * fStack_430;
      auVar246._0_4_ = fVar274 * local_408 + fVar278 * local_498 + fVar189 * fVar71;
      auVar246._4_4_ = fVar275 * fStack_404 + local_428 * fStack_494 + local_438 * fVar71;
      auVar246._8_4_ = fVar276 * fStack_400 + fStack_424 * fStack_490 + fStack_434 * fVar71;
      auVar246._12_4_ = fVar277 * fStack_3fc + fStack_420 * fStack_48c + fStack_430 * fVar71;
      auVar82 = rcpps(auVar97,auVar246);
      fVar72 = auVar82._0_4_;
      fVar145 = auVar82._4_4_;
      fVar146 = auVar82._8_4_;
      fVar147 = auVar82._12_4_;
      fVar187 = (float)DAT_01feca10;
      fVar188 = DAT_01feca10._4_4_;
      fVar211 = DAT_01feca10._12_4_;
      fVar189 = DAT_01feca10._8_4_;
      fVar72 = ((fVar187 - auVar246._0_4_ * fVar72) * fVar72 + fVar72) *
               -(fVar243 * fVar274 + auVar97._0_4_);
      fVar145 = ((fVar188 - auVar246._4_4_ * fVar145) * fVar145 + fVar145) *
                -(fVar244 * fVar275 + auVar97._4_4_);
      fVar146 = ((fVar189 - auVar246._8_4_ * fVar146) * fVar146 + fVar146) *
                -(fVar245 * fVar276 + auVar97._8_4_);
      fVar147 = ((fVar211 - auVar246._12_4_ * fVar147) * fVar147 + fVar147) *
                -(fVar256 * fVar277 + auVar97._12_4_);
      uVar66 = -(uint)(auVar246._0_4_ < 0.0 || ABS(auVar246._0_4_) < 1e-18);
      uVar67 = -(uint)(auVar246._4_4_ < 0.0 || ABS(auVar246._4_4_) < 1e-18);
      uVar68 = -(uint)(auVar246._8_4_ < 0.0 || ABS(auVar246._8_4_) < 1e-18);
      uVar69 = -(uint)(auVar246._12_4_ < 0.0 || ABS(auVar246._12_4_) < 1e-18);
      auVar198._0_8_ = CONCAT44(uVar67,uVar66) & 0xff800000ff800000;
      auVar198._8_4_ = uVar68 & 0xff800000;
      auVar198._12_4_ = uVar69 & 0xff800000;
      auVar98._0_4_ = ~uVar66 & (uint)fVar72;
      auVar98._4_4_ = ~uVar67 & (uint)fVar145;
      auVar98._8_4_ = ~uVar68 & (uint)fVar146;
      auVar98._12_4_ = ~uVar69 & (uint)fVar147;
      auVar193 = maxps(auVar193,auVar98 | auVar198);
      uVar66 = -(uint)(0.0 < auVar246._0_4_ || ABS(auVar246._0_4_) < 1e-18);
      uVar67 = -(uint)(0.0 < auVar246._4_4_ || ABS(auVar246._4_4_) < 1e-18);
      uVar68 = -(uint)(0.0 < auVar246._8_4_ || ABS(auVar246._8_4_) < 1e-18);
      uVar69 = -(uint)(0.0 < auVar246._12_4_ || ABS(auVar246._12_4_) < 1e-18);
      auVar99._0_8_ = CONCAT44(uVar67,uVar66) & 0x7f8000007f800000;
      auVar99._8_4_ = uVar68 & 0x7f800000;
      auVar99._12_4_ = uVar69 & 0x7f800000;
      auVar247._0_4_ = ~uVar66 & (uint)fVar72;
      auVar247._4_4_ = ~uVar67 & (uint)fVar145;
      auVar247._8_4_ = ~uVar68 & (uint)fVar146;
      auVar247._12_4_ = ~uVar69 & (uint)fVar147;
      auVar192 = minps(auVar192,auVar247 | auVar99);
      auVar29._4_4_ = fStack_404;
      auVar29._0_4_ = local_408;
      auVar29._8_4_ = fStack_400;
      auVar29._12_4_ = fStack_3fc;
      auVar248._0_4_ = -fVar275 * local_408 + -local_428 * local_498 + -local_438 * fVar71;
      auVar248._4_4_ = -fVar276 * fStack_404 + -fStack_424 * fStack_494 + -fStack_434 * fVar71;
      auVar248._8_4_ = -fVar277 * fStack_400 + -fStack_420 * fStack_490 + -fStack_430 * fVar71;
      auVar248._12_4_ = fStack_3fc * -0.0 + fStack_48c * -0.0 + fVar71 * -0.0;
      auVar82 = rcpps(auVar29,auVar248);
      fVar72 = auVar82._0_4_;
      fVar145 = auVar82._4_4_;
      fVar146 = auVar82._8_4_;
      fVar147 = auVar82._12_4_;
      fVar72 = ((fVar187 - auVar248._0_4_ * fVar72) * fVar72 + fVar72) *
               -((0.0 - fVar282) * -fVar275 +
                (0.0 - fVar286) * -local_428 + (0.0 - fStack_514) * -local_438);
      fVar145 = ((fVar188 - auVar248._4_4_ * fVar145) * fVar145 + fVar145) *
                -((0.0 - fVar283) * -fVar276 +
                 (0.0 - fVar287) * -fStack_424 + (0.0 - fStack_510) * -fStack_434);
      fVar146 = ((fVar189 - auVar248._8_4_ * fVar146) * fVar146 + fVar146) *
                -((0.0 - fVar284) * -fVar277 +
                 (0.0 - fVar288) * -fStack_420 + (0.0 - fStack_50c) * -fStack_430);
      fVar147 = ((fVar211 - auVar248._12_4_ * fVar147) * fVar147 + fVar147) * 0.0;
      uVar66 = -(uint)(auVar248._0_4_ < 0.0 || ABS(auVar248._0_4_) < 1e-18);
      uVar67 = -(uint)(auVar248._4_4_ < 0.0 || ABS(auVar248._4_4_) < 1e-18);
      uVar68 = -(uint)(auVar248._8_4_ < 0.0 || ABS(auVar248._8_4_) < 1e-18);
      uVar69 = -(uint)(auVar248._12_4_ < 0.0 || ABS(auVar248._12_4_) < 1e-18);
      auVar132._0_8_ = CONCAT44(uVar67,uVar66) & 0xff800000ff800000;
      auVar132._8_4_ = uVar68 & 0xff800000;
      auVar132._12_4_ = uVar69 & 0xff800000;
      auVar100._0_4_ = ~uVar66 & (uint)fVar72;
      auVar100._4_4_ = ~uVar67 & (uint)fVar145;
      auVar100._8_4_ = ~uVar68 & (uint)fVar146;
      auVar100._12_4_ = ~uVar69 & (uint)fVar147;
      auVar82 = maxps(auVar193,auVar100 | auVar132);
      uVar66 = -(uint)(0.0 < auVar248._0_4_ || ABS(auVar248._0_4_) < 1e-18);
      uVar67 = -(uint)(0.0 < auVar248._4_4_ || ABS(auVar248._4_4_) < 1e-18);
      uVar68 = -(uint)(0.0 < auVar248._8_4_ || ABS(auVar248._8_4_) < 1e-18);
      uVar69 = -(uint)(0.0 < auVar248._12_4_ || ABS(auVar248._12_4_) < 1e-18);
      auVar101._0_8_ = CONCAT44(uVar67,uVar66) & 0x7f8000007f800000;
      auVar101._8_4_ = uVar68 & 0x7f800000;
      auVar101._12_4_ = uVar69 & 0x7f800000;
      auVar249._0_4_ = ~uVar66 & (uint)fVar72;
      auVar249._4_4_ = ~uVar67 & (uint)fVar145;
      auVar249._8_4_ = ~uVar68 & (uint)fVar146;
      auVar249._12_4_ = ~uVar69 & (uint)fVar147;
      local_238 = minps(auVar192,auVar249 | auVar101);
      fVar147 = auVar82._12_4_;
      fVar72 = auVar82._0_4_;
      fVar145 = auVar82._4_4_;
      fVar146 = auVar82._8_4_;
      auVar165._0_4_ = -(uint)(fVar72 <= local_238._0_4_) & auVar181._0_4_;
      auVar165._4_4_ = -(uint)(fVar145 <= local_238._4_4_) & auVar181._4_4_;
      auVar165._8_4_ = -(uint)(fVar146 <= local_238._8_4_) & auVar181._8_4_;
      auVar165._12_4_ = -(uint)(fVar147 <= local_238._12_4_) & auVar181._12_4_;
      iVar51 = movmskps(iVar51,auVar165);
      if (iVar51 != 0) {
        auVar26._4_4_ = fStack_464;
        auVar26._0_4_ = local_468;
        auVar26._8_4_ = fStack_460;
        auVar26._12_4_ = fStack_45c;
        auVar192 = maxps(ZEXT816(0),auVar26);
        auVar31._4_4_ = local_368[1];
        auVar31._0_4_ = local_368[0];
        auVar31._8_4_ = local_368[2];
        auVar31._12_4_ = local_368[3];
        auVar193 = minps(auVar31,_DAT_01feca10);
        fVar212 = 0.0;
        fVar213 = 0.0;
        fVar233 = 0.0;
        fVar234 = 0.0;
        auVar193 = maxps(auVar193,ZEXT816(0));
        auVar30._4_4_ = local_378[1];
        auVar30._0_4_ = local_378[0];
        auVar30._8_4_ = local_378[2];
        auVar30._12_4_ = local_378[3];
        auVar230 = minps(auVar30,_DAT_01feca10);
        auVar230 = maxps(auVar230,ZEXT816(0));
        auVar27._4_4_ = local_448;
        auVar27._0_4_ = local_448;
        auVar27._8_4_ = local_448;
        auVar27._12_4_ = local_448;
        local_368[0] = (auVar193._0_4_ + 0.0) * 0.25 * local_448 + local_4a8;
        local_368[1] = (auVar193._4_4_ + 1.0) * 0.25 * local_448 + local_4a8;
        local_368[2] = (auVar193._8_4_ + 2.0) * 0.25 * local_448 + local_4a8;
        local_368[3] = (auVar193._12_4_ + 3.0) * 0.25 * local_448 + local_4a8;
        local_378[0] = (auVar230._0_4_ + 0.0) * 0.25 * local_448 + local_4a8;
        local_378[1] = (auVar230._4_4_ + 1.0) * 0.25 * local_448 + local_4a8;
        local_378[2] = (auVar230._8_4_ + 2.0) * 0.25 * local_448 + local_4a8;
        local_378[3] = (auVar230._12_4_ + 3.0) * 0.25 * local_448 + local_4a8;
        auVar133._0_4_ = fVar199 - auVar192._0_4_ * auVar192._0_4_;
        auVar133._4_4_ = fVar200 - auVar192._4_4_ * auVar192._4_4_;
        auVar133._8_4_ = fVar201 - auVar192._8_4_ * auVar192._8_4_;
        auVar133._12_4_ = fVar175 - auVar192._12_4_ * auVar192._12_4_;
        auVar232._0_4_ =
             (float)local_528._0_4_ * (float)local_528._0_4_ -
             (float)local_4d8._0_4_ * auVar133._0_4_;
        auVar232._4_4_ =
             (float)local_528._4_4_ * (float)local_528._4_4_ -
             (float)local_4d8._4_4_ * auVar133._4_4_;
        auVar232._8_4_ = fStack_520 * fStack_520 - fStack_4d0 * auVar133._8_4_;
        auVar232._12_4_ = fStack_51c * fStack_51c - fStack_4cc * auVar133._12_4_;
        local_4d8._4_4_ = -(uint)(0.0 <= auVar232._4_4_);
        local_4d8._0_4_ = -(uint)(0.0 <= auVar232._0_4_);
        fStack_4d0 = (float)-(uint)(0.0 <= auVar232._8_4_);
        fStack_4cc = (float)-(uint)(0.0 <= auVar232._12_4_);
        iVar51 = movmskps(iVar51,_local_4d8);
        if (iVar51 == 0) {
          fVar256 = 0.0;
          fVar257 = 0.0;
          fVar258 = 0.0;
          fVar261 = 0.0;
          fVar235 = 0.0;
          fVar243 = 0.0;
          fVar244 = 0.0;
          fVar245 = 0.0;
          fVar199 = 0.0;
          fVar201 = 0.0;
          fVar187 = 0.0;
          fVar211 = 0.0;
          fVar189 = 0.0;
          fVar200 = 0.0;
          fVar175 = 0.0;
          fVar188 = 0.0;
          _local_528 = ZEXT816(0);
          iVar51 = 0;
          auVar134 = _DAT_01feba00;
          auVar242 = _DAT_01feb9f0;
        }
        else {
          auVar193 = sqrtps(auVar27,auVar232);
          auVar102._0_4_ = fVar160 + fVar160;
          auVar102._4_4_ = fVar162 + fVar162;
          auVar102._8_4_ = fVar173 + fVar173;
          auVar102._12_4_ = fVar174 + fVar174;
          auVar192 = rcpps(auVar133,auVar102);
          fVar263 = auVar192._0_4_;
          fVar266 = auVar192._4_4_;
          fVar272 = auVar192._8_4_;
          fVar273 = auVar192._12_4_;
          fVar263 = (fVar187 - auVar102._0_4_ * fVar263) * fVar263 + fVar263;
          fVar266 = (fVar188 - auVar102._4_4_ * fVar266) * fVar266 + fVar266;
          fVar272 = (fVar189 - auVar102._8_4_ * fVar272) * fVar272 + fVar272;
          fVar273 = (fVar211 - auVar102._12_4_ * fVar273) * fVar273 + fVar273;
          fVar274 = (-(float)local_528._0_4_ - auVar193._0_4_) * fVar263;
          fVar275 = (-(float)local_528._4_4_ - auVar193._4_4_) * fVar266;
          fVar276 = (-fStack_520 - auVar193._8_4_) * fVar272;
          fVar277 = (-fStack_51c - auVar193._12_4_) * fVar273;
          fVar263 = (auVar193._0_4_ - (float)local_528._0_4_) * fVar263;
          fVar266 = (auVar193._4_4_ - (float)local_528._4_4_) * fVar266;
          fVar272 = (auVar193._8_4_ - fStack_520) * fVar272;
          fVar273 = (auVar193._12_4_ - fStack_51c) * fVar273;
          fVar212 = ((float)local_398._0_4_ * fVar274 + local_3b8) * local_218;
          fVar213 = ((float)local_398._4_4_ * fVar275 + fStack_3b4) * fStack_214;
          fVar233 = (fStack_390 * fVar276 + fStack_3b0) * fStack_210;
          fVar234 = (fStack_38c * fVar277 + fStack_3ac) * fStack_20c;
          fVar199 = local_408 * fVar274 - ((float)local_4c8._0_4_ * fVar212 + fVar279);
          fVar201 = fStack_404 * fVar275 - ((float)local_4c8._4_4_ * fVar213 + fVar282);
          fVar187 = fStack_400 * fVar276 - (fStack_4c0 * fVar233 + fVar283);
          fVar211 = fStack_3fc * fVar277 - (fStack_4bc * fVar234 + fVar284);
          fVar189 = local_498 * fVar274 - (local_488 * fVar212 + fVar285);
          fVar200 = fStack_494 * fVar275 - (fStack_484 * fVar213 + fVar286);
          fVar175 = fStack_490 * fVar276 - (fStack_480 * fVar233 + fVar287);
          fVar188 = fStack_48c * fVar277 - (fStack_47c * fVar234 + fVar288);
          local_528._4_4_ = fVar71 * fVar275 - (fVar213 * (float)local_4b8._4_4_ + fStack_514);
          local_528._0_4_ = fVar71 * fVar274 - (fVar212 * (float)local_4b8._0_4_ + local_518);
          fStack_520 = fVar71 * fVar276 - (fVar233 * fStack_4b0 + fStack_510);
          fStack_51c = fVar71 * fVar277 - (fVar234 * fStack_4ac + fStack_50c);
          fVar235 = ((float)local_398._0_4_ * fVar263 + local_3b8) * local_218;
          fVar243 = ((float)local_398._4_4_ * fVar266 + fStack_3b4) * fStack_214;
          fVar244 = (fStack_390 * fVar272 + fStack_3b0) * fStack_210;
          fVar245 = (fStack_38c * fVar273 + fStack_3ac) * fStack_20c;
          fVar212 = local_408 * fVar263 - ((float)local_4c8._0_4_ * fVar235 + fVar279);
          fVar213 = fStack_404 * fVar266 - ((float)local_4c8._4_4_ * fVar243 + fVar282);
          fVar233 = fStack_400 * fVar272 - (fStack_4c0 * fVar244 + fVar283);
          fVar234 = fStack_3fc * fVar273 - (fStack_4bc * fVar245 + fVar284);
          fVar256 = local_498 * fVar263 - (local_488 * fVar235 + fVar285);
          fVar257 = fStack_494 * fVar266 - (fStack_484 * fVar243 + fVar286);
          fVar258 = fStack_490 * fVar272 - (fStack_480 * fVar244 + fVar287);
          fVar261 = fStack_48c * fVar273 - (fStack_47c * fVar245 + fVar288);
          bVar8 = 0.0 <= auVar232._0_4_;
          uVar66 = -(uint)bVar8;
          bVar64 = 0.0 <= auVar232._4_4_;
          uVar67 = -(uint)bVar64;
          bVar9 = 0.0 <= auVar232._8_4_;
          uVar68 = -(uint)bVar9;
          bVar10 = 0.0 <= auVar232._12_4_;
          uVar69 = -(uint)bVar10;
          fVar235 = fVar71 * fVar263 - (fVar235 * (float)local_4b8._0_4_ + local_518);
          fVar243 = fVar71 * fVar266 - (fVar243 * (float)local_4b8._4_4_ + fStack_514);
          fVar244 = fVar71 * fVar272 - (fVar244 * fStack_4b0 + fStack_510);
          fVar245 = fVar71 * fVar273 - (fVar245 * fStack_4ac + fStack_50c);
          auVar250._0_4_ = (uint)fVar274 & uVar66;
          auVar250._4_4_ = (uint)fVar275 & uVar67;
          auVar250._8_4_ = (uint)fVar276 & uVar68;
          auVar250._12_4_ = (uint)fVar277 & uVar69;
          auVar242._0_8_ = CONCAT44(~uVar67,~uVar66) & 0x7f8000007f800000;
          auVar242._8_4_ = ~uVar68 & 0x7f800000;
          auVar242._12_4_ = ~uVar69 & 0x7f800000;
          auVar242 = auVar242 | auVar250;
          auVar208._0_4_ = (uint)fVar263 & uVar66;
          auVar208._4_4_ = (uint)fVar266 & uVar67;
          auVar208._8_4_ = (uint)fVar272 & uVar68;
          auVar208._12_4_ = (uint)fVar273 & uVar69;
          auVar134._0_8_ = CONCAT44(~uVar67,~uVar66) & 0xff800000ff800000;
          auVar134._8_4_ = ~uVar68 & 0xff800000;
          auVar134._12_4_ = ~uVar69 & 0xff800000;
          auVar134 = auVar134 | auVar208;
          auVar103._0_8_ = (ulong)local_3a8 & 0x7fffffff7fffffff;
          auVar103._8_4_ = ABS(fStack_3a0);
          auVar103._12_4_ = ABS(fStack_39c);
          auVar33._4_4_ = fStack_324;
          auVar33._0_4_ = local_328;
          auVar33._8_4_ = fStack_320;
          auVar33._12_4_ = fStack_31c;
          auVar192 = maxps(auVar33,auVar103);
          fVar263 = auVar192._0_4_ * 1.9073486e-06;
          fVar266 = auVar192._4_4_ * 1.9073486e-06;
          fVar272 = auVar192._8_4_ * 1.9073486e-06;
          fVar273 = auVar192._12_4_ * 1.9073486e-06;
          auVar209._0_4_ = -(uint)(ABS(fVar160) < fVar263 && bVar8);
          auVar209._4_4_ = -(uint)(ABS(fVar162) < fVar266 && bVar64);
          auVar209._8_4_ = -(uint)(ABS(fVar173) < fVar272 && bVar9);
          auVar209._12_4_ = -(uint)(ABS(fVar174) < fVar273 && bVar10);
          iVar51 = movmskps(iVar51,auVar209);
          if (iVar51 != 0) {
            uVar66 = -(uint)(auVar133._0_4_ <= 0.0);
            uVar67 = -(uint)(auVar133._4_4_ <= 0.0);
            uVar68 = -(uint)(auVar133._8_4_ <= 0.0);
            uVar69 = -(uint)(auVar133._12_4_ <= 0.0);
            auVar259._0_4_ = (uVar66 & 0xff800000 | ~uVar66 & 0x7f800000) & auVar209._0_4_;
            auVar259._4_4_ = (uVar67 & 0xff800000 | ~uVar67 & 0x7f800000) & auVar209._4_4_;
            auVar259._8_4_ = (uVar68 & 0xff800000 | ~uVar68 & 0x7f800000) & auVar209._8_4_;
            auVar259._12_4_ = (uVar69 & 0xff800000 | ~uVar69 & 0x7f800000) & auVar209._12_4_;
            auVar255._0_4_ = ~auVar209._0_4_ & auVar242._0_4_;
            auVar255._4_4_ = ~auVar209._4_4_ & auVar242._4_4_;
            auVar255._8_4_ = ~auVar209._8_4_ & auVar242._8_4_;
            auVar255._12_4_ = ~auVar209._12_4_ & auVar242._12_4_;
            auVar242 = auVar255 | auVar259;
            auVar260._0_4_ = (uVar66 & 0x7f800000 | ~uVar66 & 0xff800000) & auVar209._0_4_;
            auVar260._4_4_ = (uVar67 & 0x7f800000 | ~uVar67 & 0xff800000) & auVar209._4_4_;
            auVar260._8_4_ = (uVar68 & 0x7f800000 | ~uVar68 & 0xff800000) & auVar209._8_4_;
            auVar260._12_4_ = (uVar69 & 0x7f800000 | ~uVar69 & 0xff800000) & auVar209._12_4_;
            auVar210._0_4_ = ~auVar209._0_4_ & auVar134._0_4_;
            auVar210._4_4_ = ~auVar209._4_4_ & auVar134._4_4_;
            auVar210._8_4_ = ~auVar209._8_4_ & auVar134._8_4_;
            auVar210._12_4_ = ~auVar209._12_4_ & auVar134._12_4_;
            auVar134 = auVar210 | auVar260;
            local_4d8._4_4_ = -(uint)((fVar266 <= ABS(fVar162) || auVar133._4_4_ <= 0.0) && bVar64);
            local_4d8._0_4_ = -(uint)((fVar263 <= ABS(fVar160) || auVar133._0_4_ <= 0.0) && bVar8);
            fStack_4d0 = (float)-(uint)((fVar272 <= ABS(fVar173) || auVar133._8_4_ <= 0.0) && bVar9)
            ;
            fStack_4cc = (float)-(uint)((fVar273 <= ABS(fVar174) || auVar133._12_4_ <= 0.0) &&
                                       bVar10);
          }
        }
        local_4b8._4_4_ =
             -(uint)(0.3 <= ABS(fVar213 * fStack_404 + fVar257 * fStack_494 + fVar243 * fVar71));
        local_4b8._0_4_ =
             -(uint)(0.3 <= ABS(fVar212 * local_408 + fVar256 * local_498 + fVar235 * fVar71));
        fStack_4b0 = (float)-(uint)(0.3 <= ABS(fVar233 * fStack_400 +
                                               fVar258 * fStack_490 + fVar244 * fVar71));
        fStack_4ac = (float)-(uint)(0.3 <= ABS(fVar234 * fStack_3fc +
                                               fVar261 * fStack_48c + fVar245 * fVar71));
        _local_118 = auVar82;
        local_108 = minps(local_238,auVar242);
        _local_248 = maxps(auVar82,auVar134);
        local_3a8._0_4_ = -(uint)(fVar72 <= local_108._0_4_) & auVar165._0_4_;
        local_3a8._4_4_ = -(uint)(fVar145 <= local_108._4_4_) & auVar165._4_4_;
        fStack_3a0 = (float)(-(uint)(fVar146 <= local_108._8_4_) & auVar165._8_4_);
        fStack_39c = (float)(-(uint)(fVar147 <= local_108._12_4_) & auVar165._12_4_);
        local_3c8 = _local_3a8;
        _local_4c8 = _local_248;
        local_3d8._0_4_ = -(uint)(local_248._0_4_ <= local_238._0_4_) & auVar165._0_4_;
        local_3d8._4_4_ = -(uint)(local_248._4_4_ <= local_238._4_4_) & auVar165._4_4_;
        local_3d8._8_4_ = -(uint)(local_248._8_4_ <= local_238._8_4_) & auVar165._8_4_;
        local_3d8._12_4_ = -(uint)(local_248._12_4_ <= local_238._12_4_) & auVar165._12_4_;
        _local_398 = local_3d8;
        iVar51 = movmskps(iVar51,local_3d8 | _local_3a8);
        if (iVar51 != 0) {
          local_3b8 = (float)(int)local_560;
          fStack_3b4 = (float)(int)local_560;
          fStack_3b0 = (float)(int)local_560;
          fStack_3ac = (float)(int)local_560;
          local_528._0_4_ =
               -(uint)((int)local_560 <
                      ((int)((-(uint)(0.3 <= ABS((float)local_528._0_4_ * fVar71 +
                                                 fVar189 * local_498 + fVar199 * local_408)) &
                             local_4d8._0_4_) << 0x1f) >> 0x1f) + 4);
          local_528._4_4_ =
               -(uint)((int)local_560 <
                      ((int)((-(uint)(0.3 <= ABS((float)local_528._4_4_ * fVar71 +
                                                 fVar200 * fStack_494 + fVar201 * fStack_404)) &
                             local_4d8._4_4_) << 0x1f) >> 0x1f) + 4);
          fStack_520 = (float)-(uint)((int)local_560 <
                                     ((int)((-(uint)(0.3 <= ABS(fStack_520 * fVar71 +
                                                                fVar175 * fStack_490 +
                                                                fVar187 * fStack_400)) &
                                            (uint)fStack_4d0) << 0x1f) >> 0x1f) + 4);
          fStack_51c = (float)-(uint)((int)local_560 <
                                     ((int)((-(uint)(0.3 <= ABS(fStack_51c * fVar71 +
                                                                fVar188 * fStack_48c +
                                                                fVar211 * fStack_3fc)) &
                                            (uint)fStack_4cc) << 0x1f) >> 0x1f) + 4);
          local_3c8 = ~_local_528 & _local_3a8;
          iVar51 = movmskps(iVar51,local_3c8);
          if (iVar51 != 0) {
            local_488 = local_478 + fVar72;
            fStack_484 = fStack_474 + fVar145;
            fStack_480 = fStack_470 + fVar146;
            fStack_47c = fStack_46c + fVar147;
            do {
              auVar193 = ~local_3c8 & _DAT_01feb9f0 | local_3c8 & auVar82;
              auVar166._4_4_ = auVar193._0_4_;
              auVar166._0_4_ = auVar193._4_4_;
              auVar166._8_4_ = auVar193._12_4_;
              auVar166._12_4_ = auVar193._8_4_;
              auVar192 = minps(auVar166,auVar193);
              auVar135._0_8_ = auVar192._8_8_;
              auVar135._8_4_ = auVar192._0_4_;
              auVar135._12_4_ = auVar192._4_4_;
              auVar192 = minps(auVar135,auVar192);
              auVar136._0_8_ =
                   CONCAT44(-(uint)(auVar192._4_4_ == auVar193._4_4_) & local_3c8._4_4_,
                            -(uint)(auVar192._0_4_ == auVar193._0_4_) & local_3c8._0_4_);
              auVar136._8_4_ = -(uint)(auVar192._8_4_ == auVar193._8_4_) & local_3c8._8_4_;
              auVar136._12_4_ = -(uint)(auVar192._12_4_ == auVar193._12_4_) & local_3c8._12_4_;
              iVar51 = movmskps(iVar51,auVar136);
              auVar104 = local_3c8;
              if (iVar51 != 0) {
                auVar104._8_4_ = auVar136._8_4_;
                auVar104._0_8_ = auVar136._0_8_;
                auVar104._12_4_ = auVar136._12_4_;
              }
              uVar52 = movmskps(iVar51,auVar104);
              uVar63 = 0;
              if (CONCAT44(uVar58,uVar52) != 0) {
                for (; (CONCAT44(uVar58,uVar52) >> uVar63 & 1) == 0; uVar63 = uVar63 + 1) {
                }
              }
              *(undefined4 *)(local_3c8 + uVar63 * 4) = 0;
              fVar72 = local_368[uVar63];
              fVar145 = *(float *)(local_118 + uVar63 * 4);
              fVar146 = SQRT(fVar121);
              if ((float)local_3f8._0_4_ < 0.0) {
                fVar146 = sqrtf((float)local_3f8._0_4_);
                uVar63 = extraout_RAX;
              }
              auVar18._4_4_ = fVar118;
              auVar18._0_4_ = fVar117;
              auVar18._8_4_ = fVar119;
              auVar18._12_4_ = fVar120;
              auVar24._4_4_ = fStack_4e4;
              auVar24._0_4_ = local_4e8;
              auVar24._8_4_ = fStack_4e0;
              auVar24._12_4_ = fStack_4dc;
              auVar193 = minps(auVar18,auVar24);
              auVar230 = maxps(auVar18,auVar24);
              auVar22._4_4_ = fStack_4f4;
              auVar22._0_4_ = local_4f8;
              auVar22._8_4_ = fStack_4f0;
              auVar22._12_4_ = fStack_4ec;
              auVar20._4_4_ = fStack_504;
              auVar20._0_4_ = local_508;
              auVar20._8_4_ = fStack_500;
              auVar20._12_4_ = fStack_4fc;
              auVar192 = minps(auVar22,auVar20);
              auVar193 = minps(auVar193,auVar192);
              auVar192 = maxps(auVar22,auVar20);
              auVar192 = maxps(auVar230,auVar192);
              auVar182._0_8_ = auVar193._0_8_ & 0x7fffffff7fffffff;
              auVar182._8_4_ = auVar193._8_4_ & 0x7fffffff;
              auVar182._12_4_ = auVar193._12_4_ & 0x7fffffff;
              local_468 = auVar192._12_4_;
              auVar105._0_8_ = auVar192._0_8_ & 0x7fffffff7fffffff;
              auVar105._8_4_ = auVar192._8_4_ & 0x7fffffff;
              auVar105._12_4_ = ABS(local_468);
              auVar192 = maxps(auVar182,auVar105);
              fVar147 = auVar192._4_4_;
              if (auVar192._4_4_ <= auVar192._0_4_) {
                fVar147 = auVar192._0_4_;
              }
              auVar183._8_8_ = auVar192._8_8_;
              auVar183._0_8_ = auVar192._8_8_;
              if (auVar192._8_4_ <= fVar147) {
                auVar183._0_4_ = fVar147;
              }
              fVar147 = auVar183._0_4_ * 1.9073486e-06;
              local_428 = fVar146 * 1.9073486e-06;
              fStack_464 = local_468;
              fStack_460 = local_468;
              fStack_45c = local_468;
              lVar61 = 4;
              do {
                fVar211 = 1.0 - fVar72;
                fVar174 = local_4e8 * fVar211 + local_4f8 * fVar72;
                fVar189 = fStack_4e4 * fVar211 + fStack_4f4 * fVar72;
                fVar199 = fStack_4e0 * fVar211 + fStack_4f0 * fVar72;
                fVar201 = fStack_4dc * fVar211 + fStack_4ec * fVar72;
                fVar146 = (fVar117 * fVar211 + local_4e8 * fVar72) * fVar211 + fVar72 * fVar174;
                fVar160 = (fVar118 * fVar211 + fStack_4e4 * fVar72) * fVar211 + fVar72 * fVar189;
                fVar162 = (fVar119 * fVar211 + fStack_4e0 * fVar72) * fVar211 + fVar72 * fVar199;
                fVar173 = (fVar120 * fVar211 + fStack_4dc * fVar72) * fVar211 + fVar72 * fVar201;
                fVar174 = fVar174 * fVar211 + (local_4f8 * fVar211 + local_508 * fVar72) * fVar72;
                fVar200 = fVar189 * fVar211 + (fStack_4f4 * fVar211 + fStack_504 * fVar72) * fVar72;
                fVar175 = fVar199 * fVar211 + (fStack_4f0 * fVar211 + fStack_500 * fVar72) * fVar72;
                fVar188 = fVar201 * fVar211 + (fStack_4ec * fVar211 + fStack_4fc * fVar72) * fVar72;
                fVar189 = fVar211 * fVar173 + fVar72 * fVar188;
                fVar199 = (fVar174 - fVar146) * 3.0;
                fVar201 = (fVar200 - fVar160) * 3.0;
                fVar187 = (fVar175 - fVar162) * 3.0;
                fVar188 = (fVar188 - fVar173) * 3.0;
                fVar173 = (fVar145 * (float)local_3e8._0_4_ + 0.0) -
                          (fVar211 * fVar146 + fVar72 * fVar174);
                fVar174 = (fVar145 * (float)local_3e8._4_4_ + 0.0) -
                          (fVar211 * fVar160 + fVar72 * fVar200);
                fVar162 = (fVar145 * fStack_3e0 + 0.0) - (fVar211 * fVar162 + fVar72 * fVar175);
                fVar160 = (fVar145 * fStack_3dc + 0.0) - fVar189;
                fVar146 = fVar174 * fVar174;
                fStack_630 = fVar162 * fVar162;
                fStack_62c = fVar160 * fVar160;
                local_638._0_4_ = fVar146 + fVar173 * fVar173 + fStack_630;
                local_638._4_4_ = fVar146 + fVar146 + fStack_62c;
                fStack_630 = fVar146 + fStack_630 + fStack_630;
                fStack_62c = fVar146 + fStack_62c + fStack_62c;
                local_438 = (float)local_638._0_4_;
                if ((float)local_638._0_4_ < 0.0) {
                  fVar146 = sqrtf((float)local_638._0_4_);
                  uVar53 = extraout_RAX_00;
                }
                else {
                  fVar146 = SQRT((float)local_638._0_4_);
                  uVar53 = uVar63;
                }
                fVar212 = fVar211 * 6.0;
                fVar200 = (fVar72 - (fVar211 + fVar211)) * 6.0;
                fVar211 = (fVar211 - (fVar72 + fVar72)) * 6.0;
                fVar175 = fVar72 * 6.0;
                fVar213 = fVar212 * fVar117 +
                          fVar200 * local_4e8 + fVar211 * local_4f8 + fVar175 * local_508;
                fVar233 = fVar212 * fVar118 +
                          fVar200 * fStack_4e4 + fVar211 * fStack_4f4 + fVar175 * fStack_504;
                fVar175 = fVar212 * fVar119 +
                          fVar200 * fStack_4e0 + fVar211 * fStack_4f0 + fVar175 * fStack_500;
                fVar200 = fVar147;
                if (fVar147 <= local_428 * fVar145) {
                  fVar200 = local_428 * fVar145;
                }
                fVar211 = fVar201 * fVar201 + fVar199 * fVar199 + fVar187 * fVar187;
                auVar193 = ZEXT416((uint)fVar211);
                auVar192 = rsqrtss(ZEXT416((uint)fVar211),auVar193);
                fVar212 = auVar192._0_4_;
                fVar212 = fVar212 * fVar212 * fVar211 * -0.5 * fVar212 + fVar212 * 1.5;
                fVar234 = fVar187 * fVar175 + fVar201 * fVar233 + fVar199 * fVar213;
                auVar192 = rcpss(auVar193,auVar193);
                fVar235 = (2.0 - fVar211 * auVar192._0_4_) * auVar192._0_4_;
                fVar243 = fVar199 * fVar212;
                fVar244 = fVar201 * fVar212;
                fVar245 = fVar187 * fVar212;
                fVar256 = fVar188 * fVar212;
                local_5f8._0_4_ = -fVar199;
                local_5f8._4_4_ = -fVar201;
                if (fVar211 < 0.0) {
                  local_5f8 = CONCAT44(fVar201,fVar199) ^ 0x8000000080000000;
                  fVar257 = sqrtf(fVar211);
                  uVar53 = extraout_RAX_01;
                }
                else {
                  fVar257 = SQRT(fVar211);
                }
                fVar258 = fVar174 * fVar244;
                fVar261 = fVar162 * fVar245;
                fVar263 = fVar160 * fVar256;
                fVar266 = fVar258 + fVar173 * fVar243 + fVar261;
                fVar272 = fVar258 + fVar258 + fVar263;
                fVar261 = fVar258 + fVar261 + fVar261;
                fVar263 = fVar258 + fVar263 + fVar263;
                fVar258 = (fVar146 + 1.0) * (fVar147 / fVar257) + fVar146 * fVar147 + fVar200;
                fVar257 = fStack_3dc * fVar256;
                fVar234 = fVar245 * -fVar187 +
                          fVar244 * local_5f8._4_4_ + fVar243 * (float)local_5f8 +
                          fVar235 * (fVar211 * fVar175 - fVar234 * fVar187) * fVar212 * fVar162 +
                          fVar235 * (fVar211 * fVar233 - fVar234 * fVar201) * fVar212 * fVar174 +
                          fVar235 * (fVar211 * fVar213 - fVar234 * fVar199) * fVar212 * fVar173;
                fVar146 = fStack_3e0 * fVar245 +
                          (float)local_3e8._4_4_ * fVar244 + (float)local_3e8._0_4_ * fVar243;
                fVar175 = (float)local_638._0_4_ - fVar266 * fVar266;
                auVar106._0_8_ = CONCAT44((float)local_638._4_4_ - fVar272 * fVar272,fVar175);
                auVar106._8_4_ = fStack_630 - fVar261 * fVar261;
                auVar106._12_4_ = fStack_62c - fVar263 * fVar263;
                fVar233 = -fVar188 * fVar160;
                fVar212 = fStack_3e0 * fVar162;
                fVar160 = fStack_3dc * fVar160;
                fVar211 = (fVar212 +
                          (float)local_3e8._4_4_ * fVar174 + (float)local_3e8._0_4_ * fVar173) -
                          fVar266 * fVar146;
                auVar167._8_4_ = auVar106._8_4_;
                auVar167._0_8_ = auVar106._0_8_;
                auVar167._12_4_ = auVar106._12_4_;
                auVar192 = rsqrtss(auVar167,auVar106);
                fVar213 = auVar192._0_4_;
                auVar168._4_12_ = auVar192._4_12_;
                auVar168._0_4_ = fVar213 * fVar213 * fVar175 * -0.5 * fVar213 + fVar213 * 1.5;
                if (fVar175 < 0.0) {
                  local_518 = fVar266;
                  fStack_514 = fVar272;
                  fStack_510 = fVar261;
                  fStack_50c = fVar263;
                  _local_458 = auVar168;
                  local_448 = fVar146;
                  fStack_444 = fVar257;
                  fStack_440 = fStack_3e0 * fVar245;
                  fStack_43c = fVar257;
                  fVar175 = sqrtf(fVar175);
                  uVar53 = extraout_RAX_02;
                  auVar168 = _local_458;
                  fVar213 = local_518;
                  fVar146 = local_448;
                  fVar257 = fStack_444;
                }
                else {
                  fVar175 = SQRT(fVar175);
                  fVar213 = fVar266;
                }
                fVar175 = fVar175 - fVar189;
                fVar189 = ((-fVar187 * fVar162 +
                           local_5f8._4_4_ * fVar174 + (float)local_5f8 * fVar173) -
                          fVar266 * fVar234) * auVar168._0_4_ - fVar188;
                auVar17._4_4_ = fVar160;
                auVar17._0_4_ = fVar211;
                auVar17._8_4_ = fVar212;
                auVar17._12_4_ = fVar160;
                auVar152._4_12_ = auVar17._4_12_;
                auVar152._0_4_ = fVar211 * auVar168._0_4_;
                auVar252._0_8_ = CONCAT44(fVar233,fVar189) ^ 0x8000000080000000;
                auVar252._8_4_ = -fVar233;
                auVar252._12_4_ = fVar256 * -fVar188;
                auVar251._8_8_ = auVar252._8_8_;
                auVar251._0_8_ = CONCAT44(fVar234,fVar189) ^ 0x80000000;
                fVar189 = fVar234 * auVar152._0_4_ - fVar146 * fVar189;
                auVar154._0_8_ = auVar152._0_8_;
                auVar154._8_4_ = fVar160;
                auVar154._12_4_ = -fVar257;
                auVar153._8_8_ = auVar154._8_8_;
                auVar153._0_8_ = CONCAT44(fVar146,auVar152._0_4_) ^ 0x8000000000000000;
                auVar11._4_4_ = fVar189;
                auVar11._0_4_ = fVar189;
                auVar11._8_4_ = fVar189;
                auVar11._12_4_ = fVar189;
                auVar192 = divps(auVar153,auVar11);
                auVar12._4_4_ = fVar189;
                auVar12._0_4_ = fVar189;
                auVar12._8_4_ = fVar189;
                auVar12._12_4_ = fVar189;
                auVar193 = divps(auVar251,auVar12);
                fVar72 = fVar72 - (auVar192._4_4_ * fVar175 + auVar192._0_4_ * fVar213);
                fVar145 = fVar145 - (auVar193._4_4_ * fVar175 + auVar193._0_4_ * fVar213);
                if (fVar258 <= ABS(fVar213)) {
                  bVar8 = false;
                }
                else if (local_468 * 1.9073486e-06 + fVar200 + fVar258 <= ABS(fVar175)) {
                  bVar8 = false;
                }
                else {
                  fVar145 = fVar145 + (float)local_388._0_4_;
                  bVar8 = true;
                  if ((((fVar161 <= fVar145) &&
                       (fVar146 = *(float *)(ray + k * 4 + 0x80), fVar145 <= fVar146)) &&
                      (0.0 <= fVar72)) && (fVar72 <= 1.0)) {
                    auVar192 = rsqrtss(_local_638,_local_638);
                    fVar160 = auVar192._0_4_;
                    pGVar7 = (context->scene->geometries).items[uVar65].ptr;
                    uVar53 = (ulong)*(uint *)(ray + k * 4 + 0x90);
                    pRVar60 = (RTCIntersectArguments *)context;
                    if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      fVar160 = fVar160 * 1.5 + fVar160 * fVar160 * local_438 * -0.5 * fVar160;
                      fVar173 = fVar173 * fVar160;
                      fVar174 = fVar174 * fVar160;
                      fVar162 = fVar162 * fVar160;
                      fVar189 = fVar188 * fVar173 + fVar199;
                      fVar200 = fVar188 * fVar174 + fVar201;
                      fVar175 = fVar188 * fVar162 + fVar187;
                      fVar188 = fVar174 * fVar199 - fVar201 * fVar173;
                      fVar174 = fVar162 * fVar201 - fVar187 * fVar174;
                      fVar162 = fVar173 * fVar187 - fVar199 * fVar162;
                      fVar160 = fVar200 * fVar174 - fVar162 * fVar189;
                      fVar162 = fVar175 * fVar162 - fVar188 * fVar200;
                      fVar173 = fVar189 * fVar188 - fVar174 * fVar175;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x80) = fVar145;
                        *(float *)(ray + k * 4 + 0xc0) = fVar162;
                        *(float *)(ray + k * 4 + 0xd0) = fVar173;
                        *(float *)(ray + k * 4 + 0xe0) = fVar160;
                        *(float *)(ray + k * 4 + 0xf0) = fVar72;
                        *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                        *(int *)(ray + k * 4 + 0x110) = (int)local_568;
                        *(uint *)(ray + k * 4 + 0x120) = uVar65;
                        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                        uVar66 = context->user->instPrimID[0];
                        uVar53 = (ulong)uVar66;
                        *(uint *)(ray + k * 4 + 0x140) = uVar66;
                      }
                      else {
                        local_2d8._4_4_ = fVar162;
                        local_2d8._0_4_ = fVar162;
                        local_2d8._8_4_ = fVar162;
                        fStack_2cc = fVar162;
                        local_2c8 = fVar173;
                        fStack_2c4 = fVar173;
                        fStack_2c0 = fVar173;
                        fStack_2bc = fVar173;
                        local_2b8 = fVar160;
                        fStack_2b4 = fVar160;
                        fStack_2b0 = fVar160;
                        fStack_2ac = fVar160;
                        local_2a8 = fVar72;
                        fStack_2a4 = fVar72;
                        fStack_2a0 = fVar72;
                        fStack_29c = fVar72;
                        local_298 = 0;
                        uStack_290 = 0;
                        local_288 = CONCAT44(uStack_344,local_348);
                        uStack_280 = CONCAT44(uStack_33c,uStack_340);
                        local_278 = CONCAT44(uStack_334,local_338);
                        uStack_270 = CONCAT44(uStack_32c,uStack_330);
                        local_268 = context->user->instID[0];
                        uStack_264 = local_268;
                        uStack_260 = local_268;
                        uStack_25c = local_268;
                        local_258 = context->user->instPrimID[0];
                        uStack_254 = local_258;
                        uStack_250 = local_258;
                        uStack_24c = local_258;
                        *(float *)(ray + k * 4 + 0x80) = fVar145;
                        local_578 = *local_410;
                        uStack_570 = local_410[1];
                        _local_558 = (int *)&local_578;
                        uStack_550 = pGVar7->userPtr;
                        local_548 = context->user;
                        local_540 = ray;
                        local_538 = (RTCIntersectArguments *)local_2d8;
                        local_530 = 4;
                        p_Var54 = pGVar7->intersectionFilterN;
                        if (p_Var54 != (RTCFilterFunctionN)0x0) {
                          p_Var54 = (RTCFilterFunctionN)
                                    (*p_Var54)((RTCFilterFunctionNArguments *)local_558);
                        }
                        auVar107._0_4_ = -(uint)((int)local_578 == 0);
                        auVar107._4_4_ = -(uint)(local_578._4_4_ == 0);
                        auVar107._8_4_ = -(uint)((int)uStack_570 == 0);
                        auVar107._12_4_ = -(uint)(uStack_570._4_4_ == 0);
                        uVar66 = movmskps((int)p_Var54,auVar107);
                        if ((uVar66 ^ 0xf) == 0) {
                          auVar107 = auVar107 ^ _DAT_01febe20;
                          pRVar56 = (RayHitK<4> *)(ulong)(uVar66 ^ 0xf);
                        }
                        else {
                          pRVar60 = context->args;
                          pRVar55 = (RTCIntersectArguments *)pRVar60->filter;
                          if ((pRVar55 != (RTCIntersectArguments *)0x0) &&
                             ((((ulong)*(Scene **)&pRVar60->flags & 2) != 0 ||
                              (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                            pRVar55 = (RTCIntersectArguments *)(*(code *)pRVar55)(local_558);
                          }
                          auVar137._0_4_ = -(uint)((int)local_578 == 0);
                          auVar137._4_4_ = -(uint)(local_578._4_4_ == 0);
                          auVar137._8_4_ = -(uint)((int)uStack_570 == 0);
                          auVar137._12_4_ = -(uint)(uStack_570._4_4_ == 0);
                          auVar107 = auVar137 ^ _DAT_01febe20;
                          uVar66 = movmskps((int)pRVar55,auVar137);
                          pRVar56 = (RayHitK<4> *)(ulong)(uVar66 ^ 0xf);
                          if ((uVar66 ^ 0xf) != 0) {
                            RVar16 = local_538->feature_mask;
                            uVar66 = *(uint *)&local_538->context;
                            uVar67 = *(uint *)((long)&local_538->context + 4);
                            *(RTCRayQueryFlags *)(local_540 + 0xc0) =
                                 ~auVar137._0_4_ & local_538->flags |
                                 *(uint *)(local_540 + 0xc0) & auVar137._0_4_;
                            *(RTCFeatureFlags *)(local_540 + 0xc4) =
                                 ~auVar137._4_4_ & RVar16 |
                                 *(RTCFeatureFlags *)(local_540 + 0xc4) & auVar137._4_4_;
                            *(uint *)(local_540 + 200) =
                                 ~auVar137._8_4_ & uVar66 |
                                 *(uint *)(local_540 + 200) & auVar137._8_4_;
                            *(uint *)(local_540 + 0xcc) =
                                 ~auVar137._12_4_ & uVar67 |
                                 *(uint *)(local_540 + 0xcc) & auVar137._12_4_;
                            RVar16 = *(RTCFeatureFlags *)((long)&local_538->filter + 4);
                            uVar66 = *(uint *)&local_538->intersect;
                            uVar67 = *(uint *)((long)&local_538->intersect + 4);
                            *(uint *)(local_540 + 0xd0) =
                                 ~auVar137._0_4_ & *(uint *)&local_538->filter |
                                 *(uint *)(local_540 + 0xd0) & auVar137._0_4_;
                            *(RTCFeatureFlags *)(local_540 + 0xd4) =
                                 ~auVar137._4_4_ & RVar16 |
                                 *(RTCFeatureFlags *)(local_540 + 0xd4) & auVar137._4_4_;
                            *(uint *)(local_540 + 0xd8) =
                                 ~auVar137._8_4_ & uVar66 |
                                 *(uint *)(local_540 + 0xd8) & auVar137._8_4_;
                            *(uint *)(local_540 + 0xdc) =
                                 ~auVar137._12_4_ & uVar67 |
                                 *(uint *)(local_540 + 0xdc) & auVar137._12_4_;
                            RVar16 = local_538[1].feature_mask;
                            uVar66 = *(uint *)&local_538[1].context;
                            uVar67 = *(uint *)((long)&local_538[1].context + 4);
                            *(RTCRayQueryFlags *)(local_540 + 0xe0) =
                                 ~auVar137._0_4_ & local_538[1].flags |
                                 *(uint *)(local_540 + 0xe0) & auVar137._0_4_;
                            *(RTCFeatureFlags *)(local_540 + 0xe4) =
                                 ~auVar137._4_4_ & RVar16 |
                                 *(RTCFeatureFlags *)(local_540 + 0xe4) & auVar137._4_4_;
                            *(uint *)(local_540 + 0xe8) =
                                 ~auVar137._8_4_ & uVar66 |
                                 *(uint *)(local_540 + 0xe8) & auVar137._8_4_;
                            *(uint *)(local_540 + 0xec) =
                                 ~auVar137._12_4_ & uVar67 |
                                 *(uint *)(local_540 + 0xec) & auVar137._12_4_;
                            RVar16 = *(RTCFeatureFlags *)((long)&local_538[1].filter + 4);
                            uVar66 = *(uint *)&local_538[1].intersect;
                            uVar67 = *(uint *)((long)&local_538[1].intersect + 4);
                            *(uint *)(local_540 + 0xf0) =
                                 ~auVar137._0_4_ & *(uint *)&local_538[1].filter |
                                 *(uint *)(local_540 + 0xf0) & auVar137._0_4_;
                            *(RTCFeatureFlags *)(local_540 + 0xf4) =
                                 ~auVar137._4_4_ & RVar16 |
                                 *(RTCFeatureFlags *)(local_540 + 0xf4) & auVar137._4_4_;
                            *(uint *)(local_540 + 0xf8) =
                                 ~auVar137._8_4_ & uVar66 |
                                 *(uint *)(local_540 + 0xf8) & auVar137._8_4_;
                            *(uint *)(local_540 + 0xfc) =
                                 ~auVar137._12_4_ & uVar67 |
                                 *(uint *)(local_540 + 0xfc) & auVar137._12_4_;
                            RVar16 = local_538[2].feature_mask;
                            uVar66 = *(uint *)&local_538[2].context;
                            uVar67 = *(uint *)((long)&local_538[2].context + 4);
                            *(RTCRayQueryFlags *)(local_540 + 0x100) =
                                 ~auVar137._0_4_ & local_538[2].flags |
                                 *(uint *)(local_540 + 0x100) & auVar137._0_4_;
                            *(RTCFeatureFlags *)(local_540 + 0x104) =
                                 ~auVar137._4_4_ & RVar16 |
                                 *(RTCFeatureFlags *)(local_540 + 0x104) & auVar137._4_4_;
                            *(uint *)(local_540 + 0x108) =
                                 ~auVar137._8_4_ & uVar66 |
                                 *(uint *)(local_540 + 0x108) & auVar137._8_4_;
                            *(uint *)(local_540 + 0x10c) =
                                 ~auVar137._12_4_ & uVar67 |
                                 *(uint *)(local_540 + 0x10c) & auVar137._12_4_;
                            RVar16 = *(RTCFeatureFlags *)((long)&local_538[2].filter + 4);
                            uVar66 = *(uint *)&local_538[2].intersect;
                            uVar67 = *(uint *)((long)&local_538[2].intersect + 4);
                            *(uint *)(local_540 + 0x110) =
                                 *(uint *)(local_540 + 0x110) & auVar137._0_4_ |
                                 ~auVar137._0_4_ & *(uint *)&local_538[2].filter;
                            *(RTCFeatureFlags *)(local_540 + 0x114) =
                                 *(RTCFeatureFlags *)(local_540 + 0x114) & auVar137._4_4_ |
                                 ~auVar137._4_4_ & RVar16;
                            *(uint *)(local_540 + 0x118) =
                                 *(uint *)(local_540 + 0x118) & auVar137._8_4_ |
                                 ~auVar137._8_4_ & uVar66;
                            *(uint *)(local_540 + 0x11c) =
                                 *(uint *)(local_540 + 0x11c) & auVar137._12_4_ |
                                 ~auVar137._12_4_ & uVar67;
                            RVar16 = local_538[3].feature_mask;
                            uVar66 = *(uint *)&local_538[3].context;
                            uVar67 = *(uint *)((long)&local_538[3].context + 4);
                            *(RTCRayQueryFlags *)(local_540 + 0x120) =
                                 *(uint *)(local_540 + 0x120) & auVar137._0_4_ |
                                 ~auVar137._0_4_ & local_538[3].flags;
                            *(RTCFeatureFlags *)(local_540 + 0x124) =
                                 *(RTCFeatureFlags *)(local_540 + 0x124) & auVar137._4_4_ |
                                 ~auVar137._4_4_ & RVar16;
                            *(uint *)(local_540 + 0x128) =
                                 *(uint *)(local_540 + 0x128) & auVar137._8_4_ |
                                 ~auVar137._8_4_ & uVar66;
                            *(uint *)(local_540 + 300) =
                                 *(uint *)(local_540 + 300) & auVar137._12_4_ |
                                 ~auVar137._12_4_ & uVar67;
                            RVar16 = *(RTCFeatureFlags *)((long)&local_538[3].filter + 4);
                            uVar66 = *(uint *)&local_538[3].intersect;
                            uVar67 = *(uint *)((long)&local_538[3].intersect + 4);
                            *(uint *)(local_540 + 0x130) =
                                 ~auVar137._0_4_ & *(uint *)&local_538[3].filter |
                                 *(uint *)(local_540 + 0x130) & auVar137._0_4_;
                            *(RTCFeatureFlags *)(local_540 + 0x134) =
                                 ~auVar137._4_4_ & RVar16 |
                                 *(RTCFeatureFlags *)(local_540 + 0x134) & auVar137._4_4_;
                            *(uint *)(local_540 + 0x138) =
                                 ~auVar137._8_4_ & uVar66 |
                                 *(uint *)(local_540 + 0x138) & auVar137._8_4_;
                            *(uint *)(local_540 + 0x13c) =
                                 ~auVar137._12_4_ & uVar67 |
                                 *(uint *)(local_540 + 0x13c) & auVar137._12_4_;
                            RVar16 = local_538[4].feature_mask;
                            uVar66 = *(uint *)&local_538[4].context;
                            uVar67 = *(uint *)((long)&local_538[4].context + 4);
                            *(RTCRayQueryFlags *)(local_540 + 0x140) =
                                 ~auVar137._0_4_ & local_538[4].flags |
                                 *(uint *)(local_540 + 0x140) & auVar137._0_4_;
                            *(RTCFeatureFlags *)(local_540 + 0x144) =
                                 ~auVar137._4_4_ & RVar16 |
                                 *(RTCFeatureFlags *)(local_540 + 0x144) & auVar137._4_4_;
                            *(uint *)(local_540 + 0x148) =
                                 ~auVar137._8_4_ & uVar66 |
                                 *(uint *)(local_540 + 0x148) & auVar137._8_4_;
                            *(uint *)(local_540 + 0x14c) =
                                 ~auVar137._12_4_ & uVar67 |
                                 *(uint *)(local_540 + 0x14c) & auVar137._12_4_;
                            pRVar56 = local_540;
                            pRVar60 = local_538;
                          }
                        }
                        auVar108._0_4_ = auVar107._0_4_ << 0x1f;
                        auVar108._4_4_ = auVar107._4_4_ << 0x1f;
                        auVar108._8_4_ = auVar107._8_4_ << 0x1f;
                        auVar108._12_4_ = auVar107._12_4_ << 0x1f;
                        iVar51 = movmskps((int)pRVar56,auVar108);
                        uVar53 = CONCAT44((int)((ulong)pRVar56 >> 0x20),iVar51);
                        if (iVar51 == 0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar146;
                        }
                      }
                    }
                  }
                }
                bVar64 = lVar61 == 0;
                lVar61 = lVar61 + -1;
                uVar63 = CONCAT71((int7)(uVar53 >> 8),bVar64);
              } while ((!bVar8) && (!bVar64));
              fVar72 = *(float *)(ray + k * 4 + 0x80);
              local_3c8._0_4_ = -(uint)(local_488 <= fVar72) & local_3c8._0_4_;
              local_3c8._4_4_ = -(uint)(fStack_484 <= fVar72) & local_3c8._4_4_;
              local_3c8._8_4_ = -(uint)(fStack_480 <= fVar72) & local_3c8._8_4_;
              local_3c8._12_4_ = -(uint)(fStack_47c <= fVar72) & local_3c8._12_4_;
              uVar58 = (undefined4)(uVar53 >> 0x20);
              iVar51 = movmskps((int)uVar63,local_3c8);
            } while (iVar51 != 0);
          }
          auVar82 = _local_248;
          fVar72 = *(float *)(ray + k * 4 + 0x80);
          local_4c8._0_4_ = -(uint)((float)local_4c8._0_4_ + local_478 <= fVar72) & local_398._0_4_;
          local_4c8._4_4_ = -(uint)((float)local_4c8._4_4_ + fStack_474 <= fVar72) & local_398._4_4_
          ;
          fStack_4c0 = (float)(-(uint)(fStack_4c0 + fStack_470 <= fVar72) & (uint)fStack_390);
          fStack_4bc = (float)(-(uint)(fStack_4bc + fStack_46c <= fVar72) & (uint)fStack_38c);
          local_4b8._0_4_ =
               -(uint)((int)local_3b8 <
                      ((int)((local_4b8._0_4_ & local_4d8._0_4_) << 0x1f) >> 0x1f) + 4);
          local_4b8._4_4_ =
               -(uint)((int)fStack_3b4 <
                      ((int)((local_4b8._4_4_ & local_4d8._4_4_) << 0x1f) >> 0x1f) + 4);
          fStack_4b0 = (float)-(uint)((int)fStack_3b0 <
                                     ((int)(((uint)fStack_4b0 & (uint)fStack_4d0) << 0x1f) >> 0x1f)
                                     + 4);
          fStack_4ac = (float)-(uint)((int)fStack_3ac <
                                     ((int)(((uint)fStack_4ac & (uint)fStack_4cc) << 0x1f) >> 0x1f)
                                     + 4);
          local_3d8 = ~_local_4b8 & _local_4c8;
          iVar51 = movmskps(iVar51,local_3d8);
          if (iVar51 != 0) {
            local_488 = local_478 + (float)local_248._0_4_;
            fStack_484 = fStack_474 + (float)local_248._4_4_;
            fStack_480 = fStack_470 + fStack_240;
            fStack_47c = fStack_46c + fStack_23c;
            do {
              auVar193 = ~local_3d8 & _DAT_01feb9f0 | local_3d8 & auVar82;
              auVar169._4_4_ = auVar193._0_4_;
              auVar169._0_4_ = auVar193._4_4_;
              auVar169._8_4_ = auVar193._12_4_;
              auVar169._12_4_ = auVar193._8_4_;
              auVar192 = minps(auVar169,auVar193);
              auVar138._0_8_ = auVar192._8_8_;
              auVar138._8_4_ = auVar192._0_4_;
              auVar138._12_4_ = auVar192._4_4_;
              auVar192 = minps(auVar138,auVar192);
              auVar139._0_8_ =
                   CONCAT44(-(uint)(auVar192._4_4_ == auVar193._4_4_) & local_3d8._4_4_,
                            -(uint)(auVar192._0_4_ == auVar193._0_4_) & local_3d8._0_4_);
              auVar139._8_4_ = -(uint)(auVar192._8_4_ == auVar193._8_4_) & local_3d8._8_4_;
              auVar139._12_4_ = -(uint)(auVar192._12_4_ == auVar193._12_4_) & local_3d8._12_4_;
              iVar51 = movmskps(iVar51,auVar139);
              auVar109 = local_3d8;
              if (iVar51 != 0) {
                auVar109._8_4_ = auVar139._8_4_;
                auVar109._0_8_ = auVar139._0_8_;
                auVar109._12_4_ = auVar139._12_4_;
              }
              uVar52 = movmskps(iVar51,auVar109);
              uVar63 = 0;
              if (CONCAT44(uVar58,uVar52) != 0) {
                for (; (CONCAT44(uVar58,uVar52) >> uVar63 & 1) == 0; uVar63 = uVar63 + 1) {
                }
              }
              *(undefined4 *)(local_3d8 + uVar63 * 4) = 0;
              fVar72 = local_378[uVar63];
              fVar145 = *(float *)(local_238 + uVar63 * 4);
              fVar146 = SQRT(fVar121);
              if ((float)local_3f8._0_4_ < 0.0) {
                fVar146 = sqrtf((float)local_3f8._0_4_);
                uVar63 = extraout_RAX_03;
              }
              auVar19._4_4_ = fVar118;
              auVar19._0_4_ = fVar117;
              auVar19._8_4_ = fVar119;
              auVar19._12_4_ = fVar120;
              auVar25._4_4_ = fStack_4e4;
              auVar25._0_4_ = local_4e8;
              auVar25._8_4_ = fStack_4e0;
              auVar25._12_4_ = fStack_4dc;
              auVar193 = minps(auVar19,auVar25);
              auVar230 = maxps(auVar19,auVar25);
              auVar23._4_4_ = fStack_4f4;
              auVar23._0_4_ = local_4f8;
              auVar23._8_4_ = fStack_4f0;
              auVar23._12_4_ = fStack_4ec;
              auVar21._4_4_ = fStack_504;
              auVar21._0_4_ = local_508;
              auVar21._8_4_ = fStack_500;
              auVar21._12_4_ = fStack_4fc;
              auVar192 = minps(auVar23,auVar21);
              auVar193 = minps(auVar193,auVar192);
              auVar192 = maxps(auVar23,auVar21);
              auVar192 = maxps(auVar230,auVar192);
              auVar184._0_8_ = auVar193._0_8_ & 0x7fffffff7fffffff;
              auVar184._8_4_ = auVar193._8_4_ & 0x7fffffff;
              auVar184._12_4_ = auVar193._12_4_ & 0x7fffffff;
              local_468 = auVar192._12_4_;
              auVar110._0_8_ = auVar192._0_8_ & 0x7fffffff7fffffff;
              auVar110._8_4_ = auVar192._8_4_ & 0x7fffffff;
              auVar110._12_4_ = ABS(local_468);
              auVar192 = maxps(auVar184,auVar110);
              fVar147 = auVar192._4_4_;
              if (auVar192._4_4_ <= auVar192._0_4_) {
                fVar147 = auVar192._0_4_;
              }
              auVar185._8_8_ = auVar192._8_8_;
              auVar185._0_8_ = auVar192._8_8_;
              if (auVar192._8_4_ <= fVar147) {
                auVar185._0_4_ = fVar147;
              }
              fVar147 = auVar185._0_4_ * 1.9073486e-06;
              local_438 = fVar146 * 1.9073486e-06;
              fStack_464 = local_468;
              fStack_460 = local_468;
              fStack_45c = local_468;
              lVar61 = 4;
              do {
                fVar211 = 1.0 - fVar72;
                fVar174 = local_4e8 * fVar211 + local_4f8 * fVar72;
                fVar189 = fStack_4e4 * fVar211 + fStack_4f4 * fVar72;
                fVar199 = fStack_4e0 * fVar211 + fStack_4f0 * fVar72;
                fVar201 = fStack_4dc * fVar211 + fStack_4ec * fVar72;
                fVar146 = (fVar117 * fVar211 + local_4e8 * fVar72) * fVar211 + fVar72 * fVar174;
                fVar160 = (fVar118 * fVar211 + fStack_4e4 * fVar72) * fVar211 + fVar72 * fVar189;
                fVar162 = (fVar119 * fVar211 + fStack_4e0 * fVar72) * fVar211 + fVar72 * fVar199;
                fVar173 = (fVar120 * fVar211 + fStack_4dc * fVar72) * fVar211 + fVar72 * fVar201;
                fVar174 = fVar174 * fVar211 + (local_4f8 * fVar211 + local_508 * fVar72) * fVar72;
                fVar200 = fVar189 * fVar211 + (fStack_4f4 * fVar211 + fStack_504 * fVar72) * fVar72;
                fVar175 = fVar199 * fVar211 + (fStack_4f0 * fVar211 + fStack_500 * fVar72) * fVar72;
                fVar188 = fVar201 * fVar211 + (fStack_4ec * fVar211 + fStack_4fc * fVar72) * fVar72;
                fVar189 = fVar211 * fVar173 + fVar72 * fVar188;
                fVar199 = (fVar174 - fVar146) * 3.0;
                fVar201 = (fVar200 - fVar160) * 3.0;
                fVar187 = (fVar175 - fVar162) * 3.0;
                fVar188 = (fVar188 - fVar173) * 3.0;
                fVar173 = (fVar145 * (float)local_3e8._0_4_ + 0.0) -
                          (fVar211 * fVar146 + fVar72 * fVar174);
                fVar160 = (fVar145 * (float)local_3e8._4_4_ + 0.0) -
                          (fVar211 * fVar160 + fVar72 * fVar200);
                fVar162 = (fVar145 * fStack_3e0 + 0.0) - (fVar211 * fVar162 + fVar72 * fVar175);
                fVar174 = (fVar145 * fStack_3dc + 0.0) - fVar189;
                fVar146 = fVar160 * fVar160;
                fStack_630 = fVar162 * fVar162;
                fStack_62c = fVar174 * fVar174;
                local_638._0_4_ = fVar146 + fVar173 * fVar173 + fStack_630;
                local_638._4_4_ = fVar146 + fVar146 + fStack_62c;
                fStack_630 = fVar146 + fStack_630 + fStack_630;
                fStack_62c = fVar146 + fStack_62c + fStack_62c;
                local_518 = (float)local_638._0_4_;
                if ((float)local_638._0_4_ < 0.0) {
                  fVar146 = sqrtf((float)local_638._0_4_);
                  uVar53 = extraout_RAX_04;
                }
                else {
                  fVar146 = SQRT((float)local_638._0_4_);
                  uVar53 = uVar63;
                }
                fVar212 = fVar211 * 6.0;
                fVar200 = (fVar72 - (fVar211 + fVar211)) * 6.0;
                fVar211 = (fVar211 - (fVar72 + fVar72)) * 6.0;
                fVar175 = fVar72 * 6.0;
                fVar213 = fVar212 * fVar117 +
                          fVar200 * local_4e8 + fVar211 * local_4f8 + fVar175 * local_508;
                fVar233 = fVar212 * fVar118 +
                          fVar200 * fStack_4e4 + fVar211 * fStack_4f4 + fVar175 * fStack_504;
                fVar175 = fVar212 * fVar119 +
                          fVar200 * fStack_4e0 + fVar211 * fStack_4f0 + fVar175 * fStack_500;
                fVar200 = fVar147;
                if (fVar147 <= local_438 * fVar145) {
                  fVar200 = local_438 * fVar145;
                }
                fVar211 = fVar201 * fVar201 + fVar199 * fVar199 + fVar187 * fVar187;
                auVar193 = ZEXT416((uint)fVar211);
                auVar192 = rsqrtss(ZEXT416((uint)fVar211),auVar193);
                fVar212 = auVar192._0_4_;
                fVar212 = fVar212 * fVar212 * fVar211 * -0.5 * fVar212 + fVar212 * 1.5;
                fVar234 = fVar187 * fVar175 + fVar201 * fVar233 + fVar199 * fVar213;
                auVar192 = rcpss(auVar193,auVar193);
                fVar235 = (2.0 - fVar211 * auVar192._0_4_) * auVar192._0_4_;
                fVar243 = fVar199 * fVar212;
                fVar244 = fVar201 * fVar212;
                fVar245 = fVar187 * fVar212;
                fVar256 = fVar188 * fVar212;
                local_5f8._0_4_ = -fVar199;
                local_5f8._4_4_ = -fVar201;
                if (fVar211 < 0.0) {
                  local_5f8 = CONCAT44(fVar201,fVar199) ^ 0x8000000080000000;
                  fVar257 = sqrtf(fVar211);
                  uVar53 = extraout_RAX_05;
                }
                else {
                  fVar257 = SQRT(fVar211);
                }
                fVar258 = fVar160 * fVar244;
                fVar261 = fVar162 * fVar245;
                fVar263 = fVar174 * fVar256;
                fVar266 = fVar258 + fVar173 * fVar243 + fVar261;
                fVar272 = fVar258 + fVar258 + fVar263;
                fVar261 = fVar258 + fVar261 + fVar261;
                fVar263 = fVar258 + fVar263 + fVar263;
                fVar258 = (fVar146 + 1.0) * (fVar147 / fVar257) + fVar146 * fVar147 + fVar200;
                fVar257 = fStack_3dc * fVar256;
                fVar212 = fVar245 * -fVar187 +
                          fVar244 * local_5f8._4_4_ + fVar243 * (float)local_5f8 +
                          fVar235 * (fVar211 * fVar175 - fVar234 * fVar187) * fVar212 * fVar162 +
                          fVar235 * (fVar211 * fVar233 - fVar234 * fVar201) * fVar212 * fVar160 +
                          fVar235 * (fVar211 * fVar213 - fVar234 * fVar199) * fVar212 * fVar173;
                fVar175 = fStack_3e0 * fVar245 +
                          (float)local_3e8._4_4_ * fVar244 + (float)local_3e8._0_4_ * fVar243;
                fVar146 = (float)local_638._0_4_ - fVar266 * fVar266;
                auVar111._0_8_ = CONCAT44((float)local_638._4_4_ - fVar272 * fVar272,fVar146);
                auVar111._8_4_ = fStack_630 - fVar261 * fVar261;
                auVar111._12_4_ = fStack_62c - fVar263 * fVar263;
                fVar211 = -fVar188 * fVar174;
                local_428 = (fStack_3e0 * fVar162 +
                            (float)local_3e8._4_4_ * fVar160 + (float)local_3e8._0_4_ * fVar173) -
                            fVar266 * fVar175;
                fStack_424 = fStack_3dc * fVar174;
                fStack_420 = fStack_3e0 * fVar162;
                fStack_41c = fStack_3dc * fVar174;
                auVar170._8_4_ = auVar111._8_4_;
                auVar170._0_8_ = auVar111._0_8_;
                auVar170._12_4_ = auVar111._12_4_;
                auVar192 = rsqrtss(auVar170,auVar111);
                fVar174 = auVar192._0_4_;
                auVar171._4_12_ = auVar192._4_12_;
                auVar171._0_4_ = fVar174 * fVar174 * fVar146 * -0.5 * fVar174 + fVar174 * 1.5;
                if (fVar146 < 0.0) {
                  _local_458 = auVar171;
                  local_448 = fVar266;
                  fStack_444 = fVar272;
                  fStack_440 = fVar261;
                  fStack_43c = fVar263;
                  fVar146 = sqrtf(fVar146);
                  uVar53 = extraout_RAX_06;
                  auVar171 = _local_458;
                  fVar174 = local_448;
                }
                else {
                  fVar146 = SQRT(fVar146);
                  fVar174 = fVar266;
                }
                fVar146 = fVar146 - fVar189;
                fVar189 = ((-fVar187 * fVar162 +
                           local_5f8._4_4_ * fVar160 + (float)local_5f8 * fVar173) -
                          fVar266 * fVar212) * auVar171._0_4_ - fVar188;
                auVar28._4_4_ = fStack_424;
                auVar28._0_4_ = local_428;
                auVar28._8_4_ = fStack_420;
                auVar28._12_4_ = fStack_41c;
                auVar155._4_12_ = auVar28._4_12_;
                auVar155._0_4_ = local_428 * auVar171._0_4_;
                auVar254._0_8_ = CONCAT44(fVar211,fVar189) ^ 0x8000000080000000;
                auVar254._8_4_ = -fVar211;
                auVar254._12_4_ = fVar256 * -fVar188;
                auVar253._8_8_ = auVar254._8_8_;
                auVar253._0_8_ = CONCAT44(fVar212,fVar189) ^ 0x80000000;
                fVar189 = fVar212 * auVar155._0_4_ - fVar175 * fVar189;
                auVar157._0_8_ = auVar155._0_8_;
                auVar157._8_4_ = fStack_424;
                auVar157._12_4_ = -fVar257;
                auVar156._8_8_ = auVar157._8_8_;
                auVar156._0_8_ = CONCAT44(fVar175,auVar155._0_4_) ^ 0x8000000000000000;
                auVar13._4_4_ = fVar189;
                auVar13._0_4_ = fVar189;
                auVar13._8_4_ = fVar189;
                auVar13._12_4_ = fVar189;
                auVar192 = divps(auVar156,auVar13);
                auVar14._4_4_ = fVar189;
                auVar14._0_4_ = fVar189;
                auVar14._8_4_ = fVar189;
                auVar14._12_4_ = fVar189;
                auVar193 = divps(auVar253,auVar14);
                fVar72 = fVar72 - (auVar192._4_4_ * fVar146 + auVar192._0_4_ * fVar174);
                fVar145 = fVar145 - (auVar193._4_4_ * fVar146 + auVar193._0_4_ * fVar174);
                if (fVar258 <= ABS(fVar174)) {
                  bVar8 = false;
                }
                else if (local_468 * 1.9073486e-06 + fVar200 + fVar258 <= ABS(fVar146)) {
                  bVar8 = false;
                }
                else {
                  fVar145 = fVar145 + (float)local_388._0_4_;
                  bVar8 = true;
                  if ((((fVar161 <= fVar145) &&
                       (fVar146 = *(float *)(ray + k * 4 + 0x80), fVar145 <= fVar146)) &&
                      (0.0 <= fVar72)) && (fVar72 <= 1.0)) {
                    auVar192 = rsqrtss(_local_638,_local_638);
                    fVar174 = auVar192._0_4_;
                    pGVar7 = (context->scene->geometries).items[uVar65].ptr;
                    uVar53 = (ulong)*(uint *)(ray + k * 4 + 0x90);
                    pRVar60 = (RTCIntersectArguments *)context;
                    if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      fVar174 = fVar174 * 1.5 + fVar174 * fVar174 * local_518 * -0.5 * fVar174;
                      fVar173 = fVar173 * fVar174;
                      fVar160 = fVar160 * fVar174;
                      fVar162 = fVar162 * fVar174;
                      fVar174 = fVar188 * fVar173 + fVar199;
                      fVar189 = fVar188 * fVar160 + fVar201;
                      fVar200 = fVar188 * fVar162 + fVar187;
                      fVar175 = fVar160 * fVar199 - fVar201 * fVar173;
                      fVar201 = fVar162 * fVar201 - fVar187 * fVar160;
                      fVar162 = fVar173 * fVar187 - fVar199 * fVar162;
                      fVar160 = fVar189 * fVar201 - fVar162 * fVar174;
                      fVar162 = fVar200 * fVar162 - fVar175 * fVar189;
                      fVar173 = fVar174 * fVar175 - fVar201 * fVar200;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x80) = fVar145;
                        *(float *)(ray + k * 4 + 0xc0) = fVar162;
                        *(float *)(ray + k * 4 + 0xd0) = fVar173;
                        *(float *)(ray + k * 4 + 0xe0) = fVar160;
                        *(float *)(ray + k * 4 + 0xf0) = fVar72;
                        *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                        *(int *)(ray + k * 4 + 0x110) = (int)local_568;
                        *(uint *)(ray + k * 4 + 0x120) = uVar65;
                        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                        uVar66 = context->user->instPrimID[0];
                        uVar53 = (ulong)uVar66;
                        *(uint *)(ray + k * 4 + 0x140) = uVar66;
                      }
                      else {
                        local_2d8._4_4_ = fVar162;
                        local_2d8._0_4_ = fVar162;
                        local_2d8._8_4_ = fVar162;
                        fStack_2cc = fVar162;
                        local_2c8 = fVar173;
                        fStack_2c4 = fVar173;
                        fStack_2c0 = fVar173;
                        fStack_2bc = fVar173;
                        local_2b8 = fVar160;
                        fStack_2b4 = fVar160;
                        fStack_2b0 = fVar160;
                        fStack_2ac = fVar160;
                        local_2a8 = fVar72;
                        fStack_2a4 = fVar72;
                        fStack_2a0 = fVar72;
                        fStack_29c = fVar72;
                        local_298 = 0;
                        uStack_290 = 0;
                        local_288 = CONCAT44(uStack_344,local_348);
                        uStack_280 = CONCAT44(uStack_33c,uStack_340);
                        local_278 = CONCAT44(uStack_334,local_338);
                        uStack_270 = CONCAT44(uStack_32c,uStack_330);
                        local_268 = context->user->instID[0];
                        uStack_264 = local_268;
                        uStack_260 = local_268;
                        uStack_25c = local_268;
                        local_258 = context->user->instPrimID[0];
                        uStack_254 = local_258;
                        uStack_250 = local_258;
                        uStack_24c = local_258;
                        *(float *)(ray + k * 4 + 0x80) = fVar145;
                        local_578 = *local_410;
                        uStack_570 = local_410[1];
                        _local_558 = (int *)&local_578;
                        uStack_550 = pGVar7->userPtr;
                        local_548 = context->user;
                        local_540 = ray;
                        local_538 = (RTCIntersectArguments *)local_2d8;
                        local_530 = 4;
                        p_Var54 = pGVar7->intersectionFilterN;
                        if (p_Var54 != (RTCFilterFunctionN)0x0) {
                          p_Var54 = (RTCFilterFunctionN)
                                    (*p_Var54)((RTCFilterFunctionNArguments *)local_558);
                        }
                        auVar112._0_4_ = -(uint)((int)local_578 == 0);
                        auVar112._4_4_ = -(uint)(local_578._4_4_ == 0);
                        auVar112._8_4_ = -(uint)((int)uStack_570 == 0);
                        auVar112._12_4_ = -(uint)(uStack_570._4_4_ == 0);
                        uVar66 = movmskps((int)p_Var54,auVar112);
                        if ((uVar66 ^ 0xf) == 0) {
                          auVar112 = auVar112 ^ _DAT_01febe20;
                          pRVar56 = (RayHitK<4> *)(ulong)(uVar66 ^ 0xf);
                        }
                        else {
                          pRVar60 = context->args;
                          pRVar55 = (RTCIntersectArguments *)pRVar60->filter;
                          if ((pRVar55 != (RTCIntersectArguments *)0x0) &&
                             ((((ulong)*(Scene **)&pRVar60->flags & 2) != 0 ||
                              (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                            pRVar55 = (RTCIntersectArguments *)(*(code *)pRVar55)(local_558);
                          }
                          auVar140._0_4_ = -(uint)((int)local_578 == 0);
                          auVar140._4_4_ = -(uint)(local_578._4_4_ == 0);
                          auVar140._8_4_ = -(uint)((int)uStack_570 == 0);
                          auVar140._12_4_ = -(uint)(uStack_570._4_4_ == 0);
                          auVar112 = auVar140 ^ _DAT_01febe20;
                          uVar66 = movmskps((int)pRVar55,auVar140);
                          pRVar56 = (RayHitK<4> *)(ulong)(uVar66 ^ 0xf);
                          if ((uVar66 ^ 0xf) != 0) {
                            RVar16 = local_538->feature_mask;
                            uVar66 = *(uint *)&local_538->context;
                            uVar67 = *(uint *)((long)&local_538->context + 4);
                            *(RTCRayQueryFlags *)(local_540 + 0xc0) =
                                 ~auVar140._0_4_ & local_538->flags |
                                 *(uint *)(local_540 + 0xc0) & auVar140._0_4_;
                            *(RTCFeatureFlags *)(local_540 + 0xc4) =
                                 ~auVar140._4_4_ & RVar16 |
                                 *(RTCFeatureFlags *)(local_540 + 0xc4) & auVar140._4_4_;
                            *(uint *)(local_540 + 200) =
                                 ~auVar140._8_4_ & uVar66 |
                                 *(uint *)(local_540 + 200) & auVar140._8_4_;
                            *(uint *)(local_540 + 0xcc) =
                                 ~auVar140._12_4_ & uVar67 |
                                 *(uint *)(local_540 + 0xcc) & auVar140._12_4_;
                            RVar16 = *(RTCFeatureFlags *)((long)&local_538->filter + 4);
                            uVar66 = *(uint *)&local_538->intersect;
                            uVar67 = *(uint *)((long)&local_538->intersect + 4);
                            *(uint *)(local_540 + 0xd0) =
                                 ~auVar140._0_4_ & *(uint *)&local_538->filter |
                                 *(uint *)(local_540 + 0xd0) & auVar140._0_4_;
                            *(RTCFeatureFlags *)(local_540 + 0xd4) =
                                 ~auVar140._4_4_ & RVar16 |
                                 *(RTCFeatureFlags *)(local_540 + 0xd4) & auVar140._4_4_;
                            *(uint *)(local_540 + 0xd8) =
                                 ~auVar140._8_4_ & uVar66 |
                                 *(uint *)(local_540 + 0xd8) & auVar140._8_4_;
                            *(uint *)(local_540 + 0xdc) =
                                 ~auVar140._12_4_ & uVar67 |
                                 *(uint *)(local_540 + 0xdc) & auVar140._12_4_;
                            RVar16 = local_538[1].feature_mask;
                            uVar66 = *(uint *)&local_538[1].context;
                            uVar67 = *(uint *)((long)&local_538[1].context + 4);
                            *(RTCRayQueryFlags *)(local_540 + 0xe0) =
                                 ~auVar140._0_4_ & local_538[1].flags |
                                 *(uint *)(local_540 + 0xe0) & auVar140._0_4_;
                            *(RTCFeatureFlags *)(local_540 + 0xe4) =
                                 ~auVar140._4_4_ & RVar16 |
                                 *(RTCFeatureFlags *)(local_540 + 0xe4) & auVar140._4_4_;
                            *(uint *)(local_540 + 0xe8) =
                                 ~auVar140._8_4_ & uVar66 |
                                 *(uint *)(local_540 + 0xe8) & auVar140._8_4_;
                            *(uint *)(local_540 + 0xec) =
                                 ~auVar140._12_4_ & uVar67 |
                                 *(uint *)(local_540 + 0xec) & auVar140._12_4_;
                            RVar16 = *(RTCFeatureFlags *)((long)&local_538[1].filter + 4);
                            uVar66 = *(uint *)&local_538[1].intersect;
                            uVar67 = *(uint *)((long)&local_538[1].intersect + 4);
                            *(uint *)(local_540 + 0xf0) =
                                 ~auVar140._0_4_ & *(uint *)&local_538[1].filter |
                                 *(uint *)(local_540 + 0xf0) & auVar140._0_4_;
                            *(RTCFeatureFlags *)(local_540 + 0xf4) =
                                 ~auVar140._4_4_ & RVar16 |
                                 *(RTCFeatureFlags *)(local_540 + 0xf4) & auVar140._4_4_;
                            *(uint *)(local_540 + 0xf8) =
                                 ~auVar140._8_4_ & uVar66 |
                                 *(uint *)(local_540 + 0xf8) & auVar140._8_4_;
                            *(uint *)(local_540 + 0xfc) =
                                 ~auVar140._12_4_ & uVar67 |
                                 *(uint *)(local_540 + 0xfc) & auVar140._12_4_;
                            RVar16 = local_538[2].feature_mask;
                            uVar66 = *(uint *)&local_538[2].context;
                            uVar67 = *(uint *)((long)&local_538[2].context + 4);
                            *(RTCRayQueryFlags *)(local_540 + 0x100) =
                                 ~auVar140._0_4_ & local_538[2].flags |
                                 *(uint *)(local_540 + 0x100) & auVar140._0_4_;
                            *(RTCFeatureFlags *)(local_540 + 0x104) =
                                 ~auVar140._4_4_ & RVar16 |
                                 *(RTCFeatureFlags *)(local_540 + 0x104) & auVar140._4_4_;
                            *(uint *)(local_540 + 0x108) =
                                 ~auVar140._8_4_ & uVar66 |
                                 *(uint *)(local_540 + 0x108) & auVar140._8_4_;
                            *(uint *)(local_540 + 0x10c) =
                                 ~auVar140._12_4_ & uVar67 |
                                 *(uint *)(local_540 + 0x10c) & auVar140._12_4_;
                            RVar16 = *(RTCFeatureFlags *)((long)&local_538[2].filter + 4);
                            uVar66 = *(uint *)&local_538[2].intersect;
                            uVar67 = *(uint *)((long)&local_538[2].intersect + 4);
                            *(uint *)(local_540 + 0x110) =
                                 *(uint *)(local_540 + 0x110) & auVar140._0_4_ |
                                 ~auVar140._0_4_ & *(uint *)&local_538[2].filter;
                            *(RTCFeatureFlags *)(local_540 + 0x114) =
                                 *(RTCFeatureFlags *)(local_540 + 0x114) & auVar140._4_4_ |
                                 ~auVar140._4_4_ & RVar16;
                            *(uint *)(local_540 + 0x118) =
                                 *(uint *)(local_540 + 0x118) & auVar140._8_4_ |
                                 ~auVar140._8_4_ & uVar66;
                            *(uint *)(local_540 + 0x11c) =
                                 *(uint *)(local_540 + 0x11c) & auVar140._12_4_ |
                                 ~auVar140._12_4_ & uVar67;
                            RVar16 = local_538[3].feature_mask;
                            uVar66 = *(uint *)&local_538[3].context;
                            uVar67 = *(uint *)((long)&local_538[3].context + 4);
                            *(RTCRayQueryFlags *)(local_540 + 0x120) =
                                 *(uint *)(local_540 + 0x120) & auVar140._0_4_ |
                                 ~auVar140._0_4_ & local_538[3].flags;
                            *(RTCFeatureFlags *)(local_540 + 0x124) =
                                 *(RTCFeatureFlags *)(local_540 + 0x124) & auVar140._4_4_ |
                                 ~auVar140._4_4_ & RVar16;
                            *(uint *)(local_540 + 0x128) =
                                 *(uint *)(local_540 + 0x128) & auVar140._8_4_ |
                                 ~auVar140._8_4_ & uVar66;
                            *(uint *)(local_540 + 300) =
                                 *(uint *)(local_540 + 300) & auVar140._12_4_ |
                                 ~auVar140._12_4_ & uVar67;
                            RVar16 = *(RTCFeatureFlags *)((long)&local_538[3].filter + 4);
                            uVar66 = *(uint *)&local_538[3].intersect;
                            uVar67 = *(uint *)((long)&local_538[3].intersect + 4);
                            *(uint *)(local_540 + 0x130) =
                                 ~auVar140._0_4_ & *(uint *)&local_538[3].filter |
                                 *(uint *)(local_540 + 0x130) & auVar140._0_4_;
                            *(RTCFeatureFlags *)(local_540 + 0x134) =
                                 ~auVar140._4_4_ & RVar16 |
                                 *(RTCFeatureFlags *)(local_540 + 0x134) & auVar140._4_4_;
                            *(uint *)(local_540 + 0x138) =
                                 ~auVar140._8_4_ & uVar66 |
                                 *(uint *)(local_540 + 0x138) & auVar140._8_4_;
                            *(uint *)(local_540 + 0x13c) =
                                 ~auVar140._12_4_ & uVar67 |
                                 *(uint *)(local_540 + 0x13c) & auVar140._12_4_;
                            RVar16 = local_538[4].feature_mask;
                            uVar66 = *(uint *)&local_538[4].context;
                            uVar67 = *(uint *)((long)&local_538[4].context + 4);
                            *(RTCRayQueryFlags *)(local_540 + 0x140) =
                                 ~auVar140._0_4_ & local_538[4].flags |
                                 *(uint *)(local_540 + 0x140) & auVar140._0_4_;
                            *(RTCFeatureFlags *)(local_540 + 0x144) =
                                 ~auVar140._4_4_ & RVar16 |
                                 *(RTCFeatureFlags *)(local_540 + 0x144) & auVar140._4_4_;
                            *(uint *)(local_540 + 0x148) =
                                 ~auVar140._8_4_ & uVar66 |
                                 *(uint *)(local_540 + 0x148) & auVar140._8_4_;
                            *(uint *)(local_540 + 0x14c) =
                                 ~auVar140._12_4_ & uVar67 |
                                 *(uint *)(local_540 + 0x14c) & auVar140._12_4_;
                            pRVar56 = local_540;
                            pRVar60 = local_538;
                          }
                        }
                        auVar113._0_4_ = auVar112._0_4_ << 0x1f;
                        auVar113._4_4_ = auVar112._4_4_ << 0x1f;
                        auVar113._8_4_ = auVar112._8_4_ << 0x1f;
                        auVar113._12_4_ = auVar112._12_4_ << 0x1f;
                        iVar51 = movmskps((int)pRVar56,auVar113);
                        uVar53 = CONCAT44((int)((ulong)pRVar56 >> 0x20),iVar51);
                        if (iVar51 == 0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar146;
                        }
                      }
                    }
                  }
                }
                bVar64 = lVar61 == 0;
                lVar61 = lVar61 + -1;
                uVar63 = CONCAT71((int7)(uVar53 >> 8),bVar64);
              } while ((!bVar8) && (!bVar64));
              fVar72 = *(float *)(ray + k * 4 + 0x80);
              local_3d8._0_4_ = -(uint)(local_488 <= fVar72) & local_3d8._0_4_;
              local_3d8._4_4_ = -(uint)(fStack_484 <= fVar72) & local_3d8._4_4_;
              local_3d8._8_4_ = -(uint)(fStack_480 <= fVar72) & local_3d8._8_4_;
              local_3d8._12_4_ = -(uint)(fStack_47c <= fVar72) & local_3d8._12_4_;
              uVar58 = (undefined4)(uVar53 >> 0x20);
              iVar51 = movmskps((int)uVar63,local_3d8);
            } while (iVar51 != 0);
          }
          fVar72 = *(float *)(ray + k * 4 + 0x80);
          auVar186._0_4_ =
               local_528._0_4_ & local_3a8._0_4_ &
               -(uint)(local_478 + (float)local_118._0_4_ <= fVar72);
          auVar186._4_4_ =
               local_528._4_4_ & local_3a8._4_4_ &
               -(uint)(fStack_474 + (float)local_118._4_4_ <= fVar72);
          auVar186._8_4_ =
               (uint)fStack_520 & (uint)fStack_3a0 & -(uint)(fStack_470 + fStack_110 <= fVar72);
          auVar186._12_4_ =
               (uint)fStack_51c & (uint)fStack_39c & -(uint)(fStack_46c + fStack_10c <= fVar72);
          auVar158._0_4_ =
               local_4b8._0_4_ & local_4c8._0_4_ &
               -(uint)(local_478 + (float)local_248._0_4_ <= fVar72);
          auVar158._4_4_ =
               local_4b8._4_4_ & local_4c8._4_4_ &
               -(uint)(fStack_474 + (float)local_248._4_4_ <= fVar72);
          auVar158._8_4_ =
               (uint)fStack_4b0 & (uint)fStack_4c0 & -(uint)(fStack_470 + fStack_240 <= fVar72);
          auVar158._12_4_ =
               (uint)fStack_4ac & (uint)fStack_4bc & -(uint)(fStack_46c + fStack_23c <= fVar72);
          iVar51 = movmskps(iVar51,auVar158 | auVar186);
          if (iVar51 != 0) {
            *(undefined1 (*) [16])(auStack_f8 + uVar57 * 0xc) = auVar158 | auVar186;
            afStack_e8[uVar57 * 0xc] =
                 (float)(~auVar186._0_4_ & local_248._0_4_ | local_118._0_4_ & auVar186._0_4_);
            afStack_e8[uVar57 * 0xc + 1] =
                 (float)(~auVar186._4_4_ & local_248._4_4_ | local_118._4_4_ & auVar186._4_4_);
            afStack_e8[uVar57 * 0xc + 2] =
                 (float)(~auVar186._8_4_ & (uint)fStack_240 | (uint)fStack_110 & auVar186._8_4_);
            afStack_e8[uVar57 * 0xc + 3] =
                 (float)(~auVar186._12_4_ & (uint)fStack_23c | (uint)fStack_10c & auVar186._12_4_);
            afStack_d0[uVar57 * 0xc + -2] = local_4a8;
            afStack_d0[uVar57 * 0xc + -1] = fStack_4a4;
            fVar72 = (float)((int)local_560 + 1);
            pRVar60 = (RTCIntersectArguments *)(ulong)(uint)fVar72;
            afStack_d0[uVar57 * 0xc] = fVar72;
            uVar57 = (ulong)((int)uVar57 + 1);
          }
        }
      }
    }
    do {
      uVar66 = (uint)uVar57;
      if (uVar66 == 0) {
        fVar161 = *(float *)(ray + k * 4 + 0x80);
        auVar144._4_4_ = -(uint)(fStack_224 <= fVar161);
        auVar144._0_4_ = -(uint)(local_228 <= fVar161);
        auVar144._8_4_ = -(uint)(fStack_220 <= fVar161);
        auVar144._12_4_ = -(uint)(fStack_21c <= fVar161);
        uVar65 = movmskps(0,auVar144);
        uVar65 = (uint)local_350 & uVar65;
        if (uVar65 == 0) {
          return;
        }
        goto LAB_00b7aa06;
      }
      uVar57 = (ulong)(uVar66 - 1);
      fVar72 = *(float *)(ray + k * 4 + 0x80);
      auVar114._0_4_ =
           -(uint)(local_478 + afStack_e8[uVar57 * 0xc] <= fVar72) & auStack_f8[uVar57 * 0xc];
      auVar114._4_4_ =
           -(uint)(fStack_474 + afStack_e8[uVar57 * 0xc + 1] <= fVar72) &
           auStack_f8[uVar57 * 0xc + 1];
      auVar114._8_4_ =
           -(uint)(fStack_470 + afStack_e8[uVar57 * 0xc + 2] <= fVar72) &
           auStack_f8[uVar57 * 0xc + 2];
      auVar114._12_4_ =
           -(uint)(fStack_46c + afStack_e8[uVar57 * 0xc + 3] <= fVar72) &
           (uint)afStack_e8[uVar57 * 0xc + -1];
      _local_2d8 = auVar114;
      uVar67 = movmskps((int)pRVar60,auVar114);
      pRVar60 = (RTCIntersectArguments *)(ulong)uVar67;
      if (uVar67 != 0) {
        auVar141._0_4_ = (uint)afStack_e8[uVar57 * 0xc] & auVar114._0_4_;
        auVar141._4_4_ = (uint)afStack_e8[uVar57 * 0xc + 1] & auVar114._4_4_;
        auVar141._8_4_ = (uint)afStack_e8[uVar57 * 0xc + 2] & auVar114._8_4_;
        auVar141._12_4_ = (uint)afStack_e8[uVar57 * 0xc + 3] & auVar114._12_4_;
        auVar159._0_8_ = CONCAT44(~auVar114._4_4_,~auVar114._0_4_) & 0x7f8000007f800000;
        auVar159._8_4_ = ~auVar114._8_4_ & 0x7f800000;
        auVar159._12_4_ = ~auVar114._12_4_ & 0x7f800000;
        auVar159 = auVar159 | auVar141;
        auVar172._4_4_ = auVar159._0_4_;
        auVar172._0_4_ = auVar159._4_4_;
        auVar172._8_4_ = auVar159._12_4_;
        auVar172._12_4_ = auVar159._8_4_;
        auVar82 = minps(auVar172,auVar159);
        auVar142._0_8_ = auVar82._8_8_;
        auVar142._8_4_ = auVar82._0_4_;
        auVar142._12_4_ = auVar82._4_4_;
        auVar82 = minps(auVar142,auVar82);
        auVar143._0_8_ =
             CONCAT44(-(uint)(auVar82._4_4_ == auVar159._4_4_) & auVar114._4_4_,
                      -(uint)(auVar82._0_4_ == auVar159._0_4_) & auVar114._0_4_);
        auVar143._8_4_ = -(uint)(auVar82._8_4_ == auVar159._8_4_) & auVar114._8_4_;
        auVar143._12_4_ = -(uint)(auVar82._12_4_ == auVar159._12_4_) & auVar114._12_4_;
        iVar51 = movmskps((int)lVar62,auVar143);
        if (iVar51 != 0) {
          auVar114._8_4_ = auVar143._8_4_;
          auVar114._0_8_ = auVar143._0_8_;
          auVar114._12_4_ = auVar143._12_4_;
        }
        fVar72 = afStack_d0[uVar57 * 0xc + -2];
        fVar145 = afStack_d0[uVar57 * 0xc + -1];
        local_560 = (ulong)(uint)afStack_d0[uVar57 * 0xc];
        uVar68 = movmskps(afStack_d0[uVar57 * 0xc],auVar114);
        lVar62 = 0;
        if (uVar68 != 0) {
          for (; (uVar68 >> lVar62 & 1) == 0; lVar62 = lVar62 + 1) {
          }
        }
        *(undefined4 *)(local_2d8 + lVar62 * 4) = 0;
        *(undefined1 (*) [16])(auStack_f8 + uVar57 * 0xc) = _local_2d8;
        iVar51 = movmskps((int)(undefined1 (*) [16])(auStack_f8 + uVar57 * 0xc),_local_2d8);
        if (iVar51 == 0) {
          uVar66 = uVar66 - 1;
        }
        fVar145 = fVar145 - fVar72;
        _local_558 = (int *)CONCAT44(fVar145 * 0.33333334 + fVar72,fVar145 * 0.0 + fVar72);
        uStack_550 = (void *)CONCAT44(fVar145 * 1.0 + fVar72,fVar145 * 0.6666667 + fVar72);
        local_4a8 = *(float *)(local_558 + lVar62 * 4);
        fStack_4a4 = *(float *)(local_558 + lVar62 * 4 + 4);
        uStack_4a0 = 0;
        uStack_49c = 0;
        uVar57 = (ulong)uVar66;
      }
      uVar63 = uVar57;
    } while ((char)uVar67 == '\0');
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }